

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_sha2_perform_all_rounds(fio_sha2_s *s,uint8_t *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  ulong uVar92;
  uint uVar93;
  ulong uVar94;
  ulong uVar95;
  uint uVar96;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  ulong uVar101;
  uint uVar102;
  ulong uVar103;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  ulong uVar107;
  uint uVar108;
  uint uVar109;
  uint uVar110;
  uint uVar111;
  uint uVar112;
  ulong uVar113;
  
  if ((s->type & SHA_512) == 0) {
    uVar1 = (s->digest).i32[0];
    uVar2 = (s->digest).i32[1];
    uVar3 = (s->digest).i32[2];
    uVar4 = (s->digest).i32[4];
    uVar5 = (s->digest).i32[5];
    uVar6 = (s->digest).i32[6];
    uVar7 = (s->digest).i32[7];
    uVar88 = (uint)data[3] | (uint)data[2] << 8 | (uint)data[1] << 0x10 | (uint)*data << 0x18;
    uVar17 = (uint)data[0x3a] << 8 | (uint)data[0x39] << 0x10 | (uint)data[0x38] << 0x18;
    uVar18 = (uint)data[0x3e] << 8 | (uint)data[0x3d] << 0x10 | (uint)data[0x3c] << 0x18;
    iVar23 = ((uVar5 ^ uVar6) & uVar4 ^ uVar6) + uVar7 +
             ((uVar4 << 7 | uVar4 >> 0x19) ^
             (uVar4 << 0x15 | uVar4 >> 0xb) ^ (uVar4 << 0x1a | uVar4 >> 6));
    uVar19 = (uVar3 & uVar2 ^ (uVar3 ^ uVar2) & uVar1) +
             ((uVar1 << 10 | uVar1 >> 0x16) ^
             (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
             iVar23 + uVar88 + 0x428a2f98;
    uVar8 = (s->digest).i32[3];
    uVar30 = uVar8 + iVar23 + uVar88 + 0x428a2f98;
    uVar24 = (uVar30 * 0x80 | uVar30 >> 0x19) ^
             (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6);
    uVar20 = *(uint *)(data + 4);
    uVar41 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8;
    uVar73 = uVar41 | uVar20 << 0x18;
    iVar23 = ((uVar4 ^ uVar5) & uVar30 ^ uVar5) + uVar73 + uVar6;
    uVar84 = iVar23 + uVar24 + uVar3 + 0x71374491;
    uVar25 = ((uVar2 ^ uVar1) & uVar19 ^ uVar2 & uVar1) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) +
             iVar23 + uVar24 + 0x71374491;
    uVar74 = (uVar84 * 0x80 | uVar84 >> 0x19) ^
             (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6);
    uVar24 = *(uint *)(data + 8);
    uVar56 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8;
    uVar68 = uVar56 | uVar24 << 0x18;
    iVar23 = ((uVar30 ^ uVar4) & uVar84 ^ uVar4) + uVar5 + uVar68;
    uVar108 = uVar2 + iVar23 + uVar74 + 0xb5c0fbcf;
    uVar69 = ((uVar19 ^ uVar1) & uVar25 ^ uVar19 & uVar1) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) +
             uVar74 + iVar23 + -0x4a3f0431;
    uVar75 = (uVar108 * 0x80 | uVar108 >> 0x19) ^
             (uVar108 * 0x200000 | uVar108 >> 0xb) ^ (uVar108 * 0x4000000 | uVar108 >> 6);
    uVar74 = *(uint *)(data + 0xc);
    uVar90 = uVar74 >> 0x18 | (uVar74 & 0xff0000) >> 8 | (uVar74 & 0xff00) << 8;
    uVar45 = uVar90 | uVar74 << 0x18;
    iVar23 = ((uVar84 ^ uVar30) & uVar108 ^ uVar30) + uVar4 + uVar45;
    uVar76 = ((uVar25 ^ uVar19) & uVar69 ^ uVar25 & uVar19) +
             ((uVar69 * 0x400 | uVar69 >> 0x16) ^
             (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) +
             iVar23 + uVar75 + -0x164a245b;
    uVar96 = iVar23 + uVar75 + uVar1 + 0xe9b5dba5;
    uVar75 = *(uint *)(data + 0x10);
    uVar79 = uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8;
    uVar46 = uVar79 | uVar75 << 0x18;
    iVar23 = uVar30 + uVar46 + ((uVar108 ^ uVar84) & uVar96 ^ uVar84) +
             ((uVar96 * 0x80 | uVar96 >> 0x19) ^
             (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6)) + 0x3956c25b;
    uVar19 = uVar19 + iVar23;
    uVar37 = ((uVar69 ^ uVar25) & uVar76 ^ uVar69 & uVar25) +
             ((uVar76 * 0x400 | uVar76 >> 0x16) ^
             (uVar76 * 0x80000 | uVar76 >> 0xd) ^ (uVar76 * 0x40000000 | uVar76 >> 2)) + iVar23;
    uVar30 = *(uint *)(data + 0x14);
    uVar111 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8;
    uVar47 = uVar111 | uVar30 << 0x18;
    iVar23 = ((uVar19 * 0x80 | uVar19 >> 0x19) ^
             (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) +
             uVar84 + uVar47 + ((uVar96 ^ uVar108) & uVar19 ^ uVar108) + 0x59f111f1;
    uVar25 = uVar25 + iVar23;
    uVar104 = ((uVar76 ^ uVar69) & uVar37 ^ uVar76 & uVar69) +
              ((uVar37 * 0x400 | uVar37 >> 0x16) ^
              (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar23;
    uVar84 = *(uint *)(data + 0x18);
    uVar98 = uVar84 >> 0x18 | (uVar84 & 0xff0000) >> 8 | (uVar84 & 0xff00) << 8;
    uVar48 = uVar98 | uVar84 << 0x18;
    iVar23 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
             uVar108 + uVar48 + ((uVar19 ^ uVar96) & uVar25 ^ uVar96) + -0x6dc07d5c;
    uVar69 = uVar69 + iVar23;
    uVar109 = ((uVar37 ^ uVar76) & uVar104 ^ uVar37 & uVar76) +
              ((uVar104 * 0x400 | uVar104 >> 0x16) ^
              (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar23
    ;
    uVar108 = *(uint *)(data + 0x1c);
    uVar93 = uVar108 >> 0x18 | (uVar108 & 0xff0000) >> 8 | (uVar108 & 0xff00) << 8;
    uVar49 = uVar93 | uVar108 << 0x18;
    iVar23 = ((uVar69 * 0x80 | uVar69 >> 0x19) ^
             (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) +
             uVar96 + uVar49 + ((uVar25 ^ uVar19) & uVar69 ^ uVar19) + -0x54e3a12b;
    uVar76 = uVar76 + iVar23;
    uVar97 = ((uVar104 ^ uVar37) & uVar109 ^ uVar104 & uVar37) +
             ((uVar109 * 0x400 | uVar109 >> 0x16) ^
             (uVar109 * 0x80000 | uVar109 >> 0xd) ^ (uVar109 * 0x40000000 | uVar109 >> 2)) + iVar23;
    uVar96 = *(uint *)(data + 0x20);
    uVar102 = uVar96 >> 0x18 | (uVar96 & 0xff0000) >> 8 | (uVar96 & 0xff00) << 8;
    uVar50 = uVar102 | uVar96 << 0x18;
    iVar23 = uVar19 + uVar50 + ((uVar69 ^ uVar25) & uVar76 ^ uVar25) +
             ((uVar76 * 0x80 | uVar76 >> 0x19) ^
             (uVar76 * 0x200000 | uVar76 >> 0xb) ^ (uVar76 * 0x4000000 | uVar76 >> 6)) + -0x27f85568
    ;
    uVar37 = uVar37 + iVar23;
    uVar31 = ((uVar109 ^ uVar104) & uVar97 ^ uVar109 & uVar104) +
             ((uVar97 * 0x400 | uVar97 >> 0x16) ^
             (uVar97 * 0x80000 | uVar97 >> 0xd) ^ (uVar97 * 0x40000000 | uVar97 >> 2)) + iVar23;
    uVar19 = *(uint *)(data + 0x24);
    uVar105 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8;
    uVar51 = uVar105 | uVar19 << 0x18;
    iVar23 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
             (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
             uVar25 + uVar51 + ((uVar76 ^ uVar69) & uVar37 ^ uVar69) + 0x12835b01;
    uVar104 = uVar104 + iVar23;
    uVar26 = ((uVar97 ^ uVar109) & uVar31 ^ uVar97 & uVar109) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar23;
    uVar25 = *(uint *)(data + 0x28);
    uVar106 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8;
    uVar52 = uVar106 | uVar25 << 0x18;
    iVar23 = ((uVar104 * 0x80 | uVar104 >> 0x19) ^
             (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6)) +
             uVar69 + uVar52 + ((uVar37 ^ uVar76) & uVar104 ^ uVar76) + 0x243185be;
    uVar109 = uVar109 + iVar23;
    uVar85 = ((uVar31 ^ uVar97) & uVar26 ^ uVar31 & uVar97) +
             ((uVar26 * 0x400 | uVar26 >> 0x16) ^
             (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar23;
    uVar69 = *(uint *)(data + 0x2c);
    uVar99 = uVar69 >> 0x18 | (uVar69 & 0xff0000) >> 8 | (uVar69 & 0xff00) << 8;
    uVar53 = uVar99 | uVar69 << 0x18;
    iVar23 = ((uVar109 * 0x80 | uVar109 >> 0x19) ^
             (uVar109 * 0x200000 | uVar109 >> 0xb) ^ (uVar109 * 0x4000000 | uVar109 >> 6)) +
             uVar76 + uVar53 + ((uVar104 ^ uVar37) & uVar109 ^ uVar37) + 0x550c7dc3;
    uVar97 = uVar97 + iVar23;
    uVar54 = ((uVar26 ^ uVar31) & uVar85 ^ uVar26 & uVar31) +
             ((uVar85 * 0x400 | uVar85 >> 0x16) ^
             (uVar85 * 0x80000 | uVar85 >> 0xd) ^ (uVar85 * 0x40000000 | uVar85 >> 2)) + iVar23;
    uVar76 = *(uint *)(data + 0x30);
    uVar100 = uVar76 >> 0x18 | (uVar76 & 0xff0000) >> 8 | (uVar76 & 0xff00) << 8;
    uVar77 = uVar100 | uVar76 << 0x18;
    iVar23 = ((uVar97 * 0x80 | uVar97 >> 0x19) ^
             (uVar97 * 0x200000 | uVar97 >> 0xb) ^ (uVar97 * 0x4000000 | uVar97 >> 6)) +
             uVar37 + uVar77 + ((uVar109 ^ uVar104) & uVar97 ^ uVar104) + 0x72be5d74;
    uVar31 = uVar31 + iVar23;
    uVar55 = ((uVar85 ^ uVar26) & uVar54 ^ uVar85 & uVar26) +
             ((uVar54 * 0x400 | uVar54 >> 0x16) ^
             (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar23;
    uVar37 = *(uint *)(data + 0x34);
    uVar112 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8;
    uVar78 = uVar112 | uVar37 << 0x18;
    iVar23 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             uVar104 + uVar78 + ((uVar97 ^ uVar109) & uVar31 ^ uVar109) + -0x7f214e02;
    uVar26 = uVar26 + iVar23;
    uVar104 = ((uVar54 ^ uVar85) & uVar55 ^ uVar54 & uVar85) +
              ((uVar55 * 0x400 | uVar55 >> 0x16) ^
              (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar23;
    uVar89 = data[0x3b] + uVar17;
    iVar23 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
             uVar109 + uVar89 + ((uVar31 ^ uVar97) & uVar26 ^ uVar97) + -0x6423f959;
    uVar85 = uVar85 + iVar23;
    uVar109 = ((uVar55 ^ uVar54) & uVar104 ^ uVar55 & uVar54) +
              ((uVar104 * 0x400 | uVar104 >> 0x16) ^
              (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar23
    ;
    uVar110 = data[0x3f] + uVar18;
    iVar23 = ((uVar85 * 0x80 | uVar85 >> 0x19) ^
             (uVar85 * 0x200000 | uVar85 >> 0xb) ^ (uVar85 * 0x4000000 | uVar85 >> 6)) +
             uVar97 + uVar110 + ((uVar26 ^ uVar31) & uVar85 ^ uVar31) + -0x3e640e8c;
    uVar54 = uVar54 + iVar23;
    uVar97 = ((uVar104 ^ uVar55) & uVar109 ^ uVar104 & uVar55) +
             ((uVar109 * 0x400 | uVar109 >> 0x16) ^
             (uVar109 * 0x80000 | uVar109 >> 0xd) ^ (uVar109 * 0x40000000 | uVar109 >> 2)) + iVar23;
    uVar17 = uVar88 + uVar51 +
             (uVar73 >> 3 ^
             (uVar41 << 0xe | uVar73 >> 0x12) ^ ((uVar20 >> 0x18) << 0x19 | uVar73 >> 7)) +
             (uVar17 >> 10 ^ (uVar89 * 0x2000 | uVar89 >> 0x13) ^ (uVar89 * 0x8000 | uVar89 >> 0x11)
             );
    iVar23 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
             (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
             uVar31 + uVar17 + ((uVar85 ^ uVar26) & uVar54 ^ uVar26) + -0x1b64963f;
    uVar55 = uVar55 + iVar23;
    uVar31 = ((uVar109 ^ uVar104) & uVar97 ^ uVar109 & uVar104) +
             ((uVar97 * 0x400 | uVar97 >> 0x16) ^
             (uVar97 * 0x80000 | uVar97 >> 0xd) ^ (uVar97 * 0x40000000 | uVar97 >> 2)) + iVar23;
    uVar73 = uVar73 + uVar52 +
             (uVar68 >> 3 ^
             (uVar56 << 0xe | uVar68 >> 0x12) ^ ((uVar24 >> 0x18) << 0x19 | uVar68 >> 7)) +
             (uVar18 >> 10 ^ (uVar110 * 0x2000 | uVar110 >> 0x13) ^
             (uVar110 * 0x8000 | uVar110 >> 0x11));
    iVar23 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
             (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
             uVar26 + uVar73 + ((uVar54 ^ uVar85) & uVar55 ^ uVar85) + -0x1041b87a;
    uVar104 = uVar104 + iVar23;
    uVar88 = ((uVar97 ^ uVar109) & uVar31 ^ uVar97 & uVar109) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar23;
    uVar18 = uVar68 + uVar53 +
             (uVar45 >> 3 ^
             (uVar90 << 0xe | uVar45 >> 0x12) ^ ((uVar74 >> 0x18) << 0x19 | uVar45 >> 7)) +
             (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11)
             );
    iVar23 = ((uVar104 * 0x80 | uVar104 >> 0x19) ^
             (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6)) +
             uVar85 + uVar18 + ((uVar55 ^ uVar54) & uVar104 ^ uVar54) + 0xfc19dc6;
    uVar109 = uVar109 + iVar23;
    uVar26 = ((uVar31 ^ uVar97) & uVar88 ^ uVar31 & uVar97) +
             ((uVar88 * 0x400 | uVar88 >> 0x16) ^
             (uVar88 * 0x80000 | uVar88 >> 0xd) ^ (uVar88 * 0x40000000 | uVar88 >> 2)) + iVar23;
    uVar79 = uVar45 + uVar77 +
             (uVar46 >> 3 ^
             (uVar79 << 0xe | uVar46 >> 0x12) ^ ((uVar75 >> 0x18) << 0x19 | uVar46 >> 7)) +
             (uVar73 >> 10 ^ (uVar73 * 0x2000 | uVar73 >> 0x13) ^ (uVar73 * 0x8000 | uVar73 >> 0x11)
             );
    iVar23 = ((uVar109 * 0x80 | uVar109 >> 0x19) ^
             (uVar109 * 0x200000 | uVar109 >> 0xb) ^ (uVar109 * 0x4000000 | uVar109 >> 6)) +
             uVar54 + uVar79 + ((uVar104 ^ uVar55) & uVar109 ^ uVar55) + 0x240ca1cc;
    uVar97 = uVar97 + iVar23;
    uVar24 = ((uVar88 ^ uVar31) & uVar26 ^ uVar88 & uVar31) +
             ((uVar26 * 0x400 | uVar26 >> 0x16) ^
             (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar23;
    uVar41 = uVar46 + uVar78 +
             (uVar47 >> 3 ^
             (uVar111 << 0xe | uVar47 >> 0x12) ^ ((uVar30 >> 0x18) << 0x19 | uVar47 >> 7)) +
             (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11)
             );
    iVar23 = uVar55 + uVar41 + ((uVar109 ^ uVar104) & uVar97 ^ uVar104) +
             ((uVar97 * 0x80 | uVar97 >> 0x19) ^
             (uVar97 * 0x200000 | uVar97 >> 0xb) ^ (uVar97 * 0x4000000 | uVar97 >> 6)) + 0x2de92c6f;
    uVar31 = uVar31 + iVar23;
    uVar30 = ((uVar26 ^ uVar88) & uVar24 ^ uVar26 & uVar88) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar23;
    uVar45 = uVar47 + uVar89 +
             (uVar48 >> 3 ^
             (uVar98 << 0xe | uVar48 >> 0x12) ^ ((uVar84 >> 0x18) << 0x19 | uVar48 >> 7)) +
             (uVar79 >> 10 ^ (uVar79 * 0x2000 | uVar79 >> 0x13) ^ (uVar79 * 0x8000 | uVar79 >> 0x11)
             );
    iVar23 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             uVar104 + uVar45 + ((uVar97 ^ uVar109) & uVar31 ^ uVar109) + 0x4a7484aa;
    uVar88 = uVar88 + iVar23;
    uVar74 = ((uVar24 ^ uVar26) & uVar30 ^ uVar24 & uVar26) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar23;
    uVar108 = uVar48 + uVar110 +
              (uVar49 >> 3 ^
              (uVar93 << 0xe | uVar49 >> 0x12) ^ ((uVar108 >> 0x18) << 0x19 | uVar49 >> 7)) +
              (uVar41 >> 10 ^
              (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11));
    iVar23 = ((uVar88 * 0x80 | uVar88 >> 0x19) ^
             (uVar88 * 0x200000 | uVar88 >> 0xb) ^ (uVar88 * 0x4000000 | uVar88 >> 6)) +
             uVar109 + uVar108 + ((uVar31 ^ uVar97) & uVar88 ^ uVar97) + 0x5cb0a9dc;
    uVar26 = uVar26 + iVar23;
    uVar20 = ((uVar30 ^ uVar24) & uVar74 ^ uVar30 & uVar24) +
             ((uVar74 * 0x400 | uVar74 >> 0x16) ^
             (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar23;
    uVar46 = (uVar50 >> 3 ^
             (uVar102 << 0xe | uVar50 >> 0x12) ^ ((uVar96 >> 0x18) << 0x19 | uVar50 >> 7)) + uVar49
             + uVar17 +
             (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)
             );
    iVar23 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
             uVar97 + uVar46 + ((uVar88 ^ uVar31) & uVar26 ^ uVar31) + 0x76f988da;
    uVar24 = uVar24 + iVar23;
    uVar56 = ((uVar74 ^ uVar30) & uVar20 ^ uVar74 & uVar30) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar23;
    uVar96 = (uVar51 >> 3 ^
             (uVar105 << 0xe | uVar51 >> 0x12) ^ ((uVar19 >> 0x18) << 0x19 | uVar51 >> 7)) + uVar50
             + uVar73 +
             (uVar108 >> 10 ^
             (uVar108 * 0x2000 | uVar108 >> 0x13) ^ (uVar108 * 0x8000 | uVar108 >> 0x11));
    iVar23 = ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
             uVar31 + uVar96 + ((uVar26 ^ uVar88) & uVar24 ^ uVar88) + -0x67c1aeae;
    uVar30 = uVar30 + iVar23;
    uVar111 = ((uVar20 ^ uVar74) & uVar56 ^ uVar20 & uVar74) +
              ((uVar56 * 0x400 | uVar56 >> 0x16) ^
              (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar23;
    uVar105 = (uVar52 >> 3 ^
              (uVar106 << 0xe | uVar52 >> 0x12) ^ ((uVar25 >> 0x18) << 0x19 | uVar52 >> 7)) + uVar51
              + uVar18 +
              (uVar46 >> 10 ^
              (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
    iVar23 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
             (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
             uVar88 + uVar105 + ((uVar24 ^ uVar26) & uVar30 ^ uVar26) + -0x57ce3993;
    uVar74 = uVar74 + iVar23;
    uVar90 = ((uVar56 ^ uVar20) & uVar111 ^ uVar56 & uVar20) +
             ((uVar111 * 0x400 | uVar111 >> 0x16) ^
             (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar23;
    uVar93 = (uVar53 >> 3 ^
             (uVar99 << 0xe | uVar53 >> 0x12) ^ ((uVar69 >> 0x18) << 0x19 | uVar53 >> 7)) + uVar52 +
             uVar79 + (uVar96 >> 10 ^
                      (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11));
    iVar23 = ((uVar74 * 0x80 | uVar74 >> 0x19) ^
             (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) +
             uVar26 + uVar93 + ((uVar30 ^ uVar24) & uVar74 ^ uVar24) + -0x4ffcd838;
    uVar20 = uVar20 + iVar23;
    uVar98 = ((uVar111 ^ uVar56) & uVar90 ^ uVar111 & uVar56) +
             ((uVar90 * 0x400 | uVar90 >> 0x16) ^
             (uVar90 * 0x80000 | uVar90 >> 0xd) ^ (uVar90 * 0x40000000 | uVar90 >> 2)) + iVar23;
    uVar75 = (uVar77 >> 3 ^
             (uVar100 << 0xe | uVar77 >> 0x12) ^ ((uVar76 >> 0x18) << 0x19 | uVar77 >> 7)) + uVar53
             + uVar41 +
             (uVar105 >> 10 ^
             (uVar105 * 0x2000 | uVar105 >> 0x13) ^ (uVar105 * 0x8000 | uVar105 >> 0x11));
    iVar23 = uVar24 + uVar75 + ((uVar74 ^ uVar30) & uVar20 ^ uVar30) +
             ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + -0x40a68039
    ;
    uVar56 = uVar56 + iVar23;
    uVar106 = ((uVar90 ^ uVar111) & uVar98 ^ uVar90 & uVar111) +
              ((uVar98 * 0x400 | uVar98 >> 0x16) ^
              (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar23;
    uVar19 = (uVar78 >> 3 ^
             (uVar112 << 0xe | uVar78 >> 0x12) ^ ((uVar37 >> 0x18) << 0x19 | uVar78 >> 7)) + uVar77
             + uVar45 +
             (uVar93 >> 10 ^ (uVar93 * 0x2000 | uVar93 >> 0x13) ^ (uVar93 * 0x8000 | uVar93 >> 0x11)
             );
    iVar23 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
             (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
             uVar30 + uVar19 + ((uVar20 ^ uVar74) & uVar56 ^ uVar74) + -0x391ff40d;
    uVar111 = uVar111 + iVar23;
    uVar24 = ((uVar98 ^ uVar90) & uVar106 ^ uVar98 & uVar90) +
             ((uVar106 * 0x400 | uVar106 >> 0x16) ^
             (uVar106 * 0x80000 | uVar106 >> 0xd) ^ (uVar106 * 0x40000000 | uVar106 >> 2)) + iVar23;
    uVar30 = (uVar89 >> 3 ^
             (uVar89 * 0x4000 | uVar89 >> 0x12) ^ ((uint)data[0x3b] << 0x19 | uVar89 >> 7)) + uVar78
             + uVar108 +
             (uVar75 >> 10 ^ (uVar75 * 0x2000 | uVar75 >> 0x13) ^ (uVar75 * 0x8000 | uVar75 >> 0x11)
             );
    iVar23 = ((uVar111 * 0x80 | uVar111 >> 0x19) ^
             (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6)) +
             uVar74 + uVar30 + ((uVar56 ^ uVar20) & uVar111 ^ uVar20) + -0x2a586eb9;
    uVar90 = uVar90 + iVar23;
    uVar74 = ((uVar106 ^ uVar98) & uVar24 ^ uVar106 & uVar98) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar23;
    uVar25 = (uVar110 >> 3 ^
             (uVar110 * 0x4000 | uVar110 >> 0x12) ^ ((uint)data[0x3f] << 0x19 | uVar110 >> 7)) +
             uVar89 + uVar46 +
             (uVar19 >> 10 ^ (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11)
             );
    iVar23 = uVar20 + uVar25 + ((uVar111 ^ uVar56) & uVar90 ^ uVar56) +
             ((uVar90 * 0x80 | uVar90 >> 0x19) ^
             (uVar90 * 0x200000 | uVar90 >> 0xb) ^ (uVar90 * 0x4000000 | uVar90 >> 6)) + 0x6ca6351;
    uVar98 = uVar98 + iVar23;
    uVar20 = ((uVar24 ^ uVar106) & uVar74 ^ uVar24 & uVar106) +
             ((uVar74 * 0x400 | uVar74 >> 0x16) ^
             (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar23;
    uVar84 = (uVar17 >> 3 ^ (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7))
             + uVar110 + uVar96 +
             (uVar30 >> 10 ^ (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11)
             );
    iVar23 = ((uVar98 * 0x80 | uVar98 >> 0x19) ^
             (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6)) +
             uVar56 + uVar84 + ((uVar90 ^ uVar111) & uVar98 ^ uVar111) + 0x14292967;
    uVar106 = uVar106 + iVar23;
    uVar56 = ((uVar74 ^ uVar24) & uVar20 ^ uVar74 & uVar24) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar23;
    uVar69 = (uVar73 >> 3 ^ (uVar73 * 0x4000 | uVar73 >> 0x12) ^ (uVar73 * 0x2000000 | uVar73 >> 7))
             + uVar17 + uVar105 +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    iVar23 = ((uVar106 * 0x80 | uVar106 >> 0x19) ^
             (uVar106 * 0x200000 | uVar106 >> 0xb) ^ (uVar106 * 0x4000000 | uVar106 >> 6)) +
             uVar111 + uVar69 + ((uVar98 ^ uVar90) & uVar106 ^ uVar90) + 0x27b70a85;
    uVar24 = uVar24 + iVar23;
    uVar111 = ((uVar20 ^ uVar74) & uVar56 ^ uVar20 & uVar74) +
              ((uVar56 * 0x400 | uVar56 >> 0x16) ^
              (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar23;
    uVar26 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7))
             + uVar73 + uVar93 +
             (uVar84 >> 10 ^ (uVar84 * 0x2000 | uVar84 >> 0x13) ^ (uVar84 * 0x8000 | uVar84 >> 0x11)
             );
    iVar23 = uVar90 + uVar26 + ((uVar106 ^ uVar98) & uVar24 ^ uVar98) +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) + 0x2e1b2138;
    uVar74 = uVar74 + iVar23;
    uVar90 = ((uVar56 ^ uVar20) & uVar111 ^ uVar56 & uVar20) +
             ((uVar111 * 0x400 | uVar111 >> 0x16) ^
             (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar23;
    uVar76 = (uVar79 >> 3 ^ (uVar79 * 0x4000 | uVar79 >> 0x12) ^ (uVar79 * 0x2000000 | uVar79 >> 7))
             + uVar18 + uVar75 +
             (uVar69 >> 10 ^ (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11)
             );
    iVar23 = ((uVar74 * 0x80 | uVar74 >> 0x19) ^
             (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) +
             uVar98 + uVar76 + ((uVar24 ^ uVar106) & uVar74 ^ uVar106) + 0x4d2c6dfc;
    uVar20 = uVar20 + iVar23;
    uVar102 = ((uVar111 ^ uVar56) & uVar90 ^ uVar111 & uVar56) +
              ((uVar90 * 0x400 | uVar90 >> 0x16) ^
              (uVar90 * 0x80000 | uVar90 >> 0xd) ^ (uVar90 * 0x40000000 | uVar90 >> 2)) + iVar23;
    uVar18 = (uVar41 >> 3 ^ (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7))
             + uVar79 + uVar19 +
             (uVar26 >> 10 ^ (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11)
             );
    iVar23 = ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) +
             uVar106 + uVar18 + ((uVar74 ^ uVar24) & uVar20 ^ uVar24) + 0x53380d13;
    uVar56 = uVar56 + iVar23;
    uVar98 = ((uVar90 ^ uVar111) & uVar102 ^ uVar90 & uVar111) +
             ((uVar102 * 0x400 | uVar102 >> 0x16) ^
             (uVar102 * 0x80000 | uVar102 >> 0xd) ^ (uVar102 * 0x40000000 | uVar102 >> 2)) + iVar23;
    uVar31 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7))
             + uVar41 + uVar30 +
             (uVar76 >> 10 ^ (uVar76 * 0x2000 | uVar76 >> 0x13) ^ (uVar76 * 0x8000 | uVar76 >> 0x11)
             );
    iVar23 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
             (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
             uVar24 + uVar31 + ((uVar20 ^ uVar74) & uVar56 ^ uVar74) + 0x650a7354;
    uVar111 = uVar111 + iVar23;
    uVar24 = ((uVar102 ^ uVar90) & uVar98 ^ uVar102 & uVar90) +
             ((uVar98 * 0x400 | uVar98 >> 0x16) ^
             (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar23;
    uVar99 = (uVar108 >> 3 ^
             (uVar108 * 0x4000 | uVar108 >> 0x12) ^ (uVar108 * 0x2000000 | uVar108 >> 7)) + uVar45 +
             uVar25 + (uVar18 >> 10 ^
                      (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
    iVar23 = ((uVar111 * 0x80 | uVar111 >> 0x19) ^
             (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6)) +
             uVar74 + uVar99 + ((uVar56 ^ uVar20) & uVar111 ^ uVar20) + 0x766a0abb;
    uVar90 = uVar90 + iVar23;
    uVar74 = ((uVar98 ^ uVar102) & uVar24 ^ uVar98 & uVar102) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar23;
    uVar17 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7))
             + uVar108 + uVar84 +
             (uVar31 >> 10 ^ (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11)
             );
    iVar23 = ((uVar90 * 0x80 | uVar90 >> 0x19) ^
             (uVar90 * 0x200000 | uVar90 >> 0xb) ^ (uVar90 * 0x4000000 | uVar90 >> 6)) +
             uVar20 + uVar17 + ((uVar111 ^ uVar56) & uVar90 ^ uVar56) + -0x7e3d36d2;
    uVar102 = uVar102 + iVar23;
    uVar20 = ((uVar24 ^ uVar98) & uVar74 ^ uVar24 & uVar98) +
             ((uVar74 * 0x400 | uVar74 >> 0x16) ^
             (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar23;
    uVar37 = (uVar96 >> 3 ^ (uVar96 * 0x4000 | uVar96 >> 0x12) ^ (uVar96 * 0x2000000 | uVar96 >> 7))
             + uVar46 + uVar69 +
             (uVar99 >> 10 ^ (uVar99 * 0x2000 | uVar99 >> 0x13) ^ (uVar99 * 0x8000 | uVar99 >> 0x11)
             );
    iVar23 = uVar56 + uVar37 + ((uVar90 ^ uVar111) & uVar102 ^ uVar111) +
             ((uVar102 * 0x80 | uVar102 >> 0x19) ^
             (uVar102 * 0x200000 | uVar102 >> 0xb) ^ (uVar102 * 0x4000000 | uVar102 >> 6)) +
             -0x6d8dd37b;
    uVar98 = uVar98 + iVar23;
    uVar56 = ((uVar74 ^ uVar24) & uVar20 ^ uVar74 & uVar24) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar23;
    uVar108 = (uVar105 >> 3 ^
              (uVar105 * 0x4000 | uVar105 >> 0x12) ^ (uVar105 * 0x2000000 | uVar105 >> 7)) + uVar96
              + uVar26 +
              (uVar17 >> 10 ^
              (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
    iVar23 = ((uVar98 * 0x80 | uVar98 >> 0x19) ^
             (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6)) +
             uVar111 + uVar108 + ((uVar102 ^ uVar90) & uVar98 ^ uVar90) + -0x5d40175f;
    uVar24 = uVar24 + iVar23;
    uVar112 = ((uVar20 ^ uVar74) & uVar56 ^ uVar20 & uVar74) +
              ((uVar56 * 0x400 | uVar56 >> 0x16) ^
              (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar23;
    uVar96 = (uVar93 >> 3 ^ (uVar93 * 0x4000 | uVar93 >> 0x12) ^ (uVar93 * 0x2000000 | uVar93 >> 7))
             + uVar105 + uVar76 +
             (uVar37 >> 10 ^ (uVar37 * 0x2000 | uVar37 >> 0x13) ^ (uVar37 * 0x8000 | uVar37 >> 0x11)
             );
    iVar23 = ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
             uVar90 + uVar96 + ((uVar98 ^ uVar102) & uVar24 ^ uVar102) + -0x57e599b5;
    uVar74 = uVar74 + iVar23;
    uVar79 = ((uVar56 ^ uVar20) & uVar112 ^ uVar56 & uVar20) +
             ((uVar112 * 0x400 | uVar112 >> 0x16) ^
             (uVar112 * 0x80000 | uVar112 >> 0xd) ^ (uVar112 * 0x40000000 | uVar112 >> 2)) + iVar23;
    uVar41 = (uVar75 >> 3 ^ (uVar75 * 0x4000 | uVar75 >> 0x12) ^ (uVar75 * 0x2000000 | uVar75 >> 7))
             + uVar93 + uVar18 +
             (uVar108 >> 10 ^
             (uVar108 * 0x2000 | uVar108 >> 0x13) ^ (uVar108 * 0x8000 | uVar108 >> 0x11));
    iVar23 = ((uVar74 * 0x80 | uVar74 >> 0x19) ^
             (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) +
             uVar102 + uVar41 + ((uVar24 ^ uVar98) & uVar74 ^ uVar98) + -0x3db47490;
    uVar20 = uVar20 + iVar23;
    uVar106 = ((uVar112 ^ uVar56) & uVar79 ^ uVar112 & uVar56) +
              ((uVar79 * 0x400 | uVar79 >> 0x16) ^
              (uVar79 * 0x80000 | uVar79 >> 0xd) ^ (uVar79 * 0x40000000 | uVar79 >> 2)) + iVar23;
    uVar102 = (uVar19 >> 3 ^ (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)
              ) + uVar75 + uVar31 +
              (uVar96 >> 10 ^
              (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11));
    iVar23 = ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) +
             uVar98 + uVar102 + ((uVar74 ^ uVar24) & uVar20 ^ uVar24) + -0x3893ae5d;
    uVar56 = uVar56 + iVar23;
    uVar75 = ((uVar79 ^ uVar112) & uVar106 ^ uVar79 & uVar112) +
             ((uVar106 * 0x400 | uVar106 >> 0x16) ^
             (uVar106 * 0x80000 | uVar106 >> 0xd) ^ (uVar106 * 0x40000000 | uVar106 >> 2)) + iVar23;
    uVar105 = (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7)
              ) + uVar19 + uVar99 +
              (uVar41 >> 10 ^
              (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11));
    iVar23 = uVar24 + uVar105 + ((uVar20 ^ uVar74) & uVar56 ^ uVar74) +
             ((uVar56 * 0x80 | uVar56 >> 0x19) ^
             (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) + -0x2e6d17e7
    ;
    uVar112 = uVar112 + iVar23;
    uVar90 = ((uVar106 ^ uVar79) & uVar75 ^ uVar106 & uVar79) +
             ((uVar75 * 0x400 | uVar75 >> 0x16) ^
             (uVar75 * 0x80000 | uVar75 >> 0xd) ^ (uVar75 * 0x40000000 | uVar75 >> 2)) + iVar23;
    uVar98 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7))
             + uVar30 + uVar17 +
             (uVar102 >> 10 ^
             (uVar102 * 0x2000 | uVar102 >> 0x13) ^ (uVar102 * 0x8000 | uVar102 >> 0x11));
    iVar23 = ((uVar112 * 0x80 | uVar112 >> 0x19) ^
             (uVar112 * 0x200000 | uVar112 >> 0xb) ^ (uVar112 * 0x4000000 | uVar112 >> 6)) +
             uVar74 + uVar98 + ((uVar56 ^ uVar20) & uVar112 ^ uVar20) + -0x2966f9dc;
    uVar79 = uVar79 + iVar23;
    uVar111 = ((uVar75 ^ uVar106) & uVar90 ^ uVar75 & uVar106) +
              ((uVar90 * 0x400 | uVar90 >> 0x16) ^
              (uVar90 * 0x80000 | uVar90 >> 0xd) ^ (uVar90 * 0x40000000 | uVar90 >> 2)) + iVar23;
    uVar19 = (uVar84 >> 3 ^ (uVar84 * 0x4000 | uVar84 >> 0x12) ^ (uVar84 * 0x2000000 | uVar84 >> 7))
             + uVar25 + uVar37 +
             (uVar105 >> 10 ^
             (uVar105 * 0x2000 | uVar105 >> 0x13) ^ (uVar105 * 0x8000 | uVar105 >> 0x11));
    iVar23 = uVar20 + uVar19 + ((uVar112 ^ uVar56) & uVar79 ^ uVar56) +
             ((uVar79 * 0x80 | uVar79 >> 0x19) ^
             (uVar79 * 0x200000 | uVar79 >> 0xb) ^ (uVar79 * 0x4000000 | uVar79 >> 6)) + -0xbf1ca7b;
    uVar106 = uVar106 + iVar23;
    uVar93 = ((uVar90 ^ uVar75) & uVar111 ^ uVar90 & uVar75) +
             ((uVar111 * 0x400 | uVar111 >> 0x16) ^
             (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar23;
    uVar30 = (uVar69 >> 3 ^ (uVar69 * 0x4000 | uVar69 >> 0x12) ^ (uVar69 * 0x2000000 | uVar69 >> 7))
             + uVar84 + uVar108 +
             (uVar98 >> 10 ^ (uVar98 * 0x2000 | uVar98 >> 0x13) ^ (uVar98 * 0x8000 | uVar98 >> 0x11)
             );
    iVar23 = ((uVar106 * 0x80 | uVar106 >> 0x19) ^
             (uVar106 * 0x200000 | uVar106 >> 0xb) ^ (uVar106 * 0x4000000 | uVar106 >> 6)) +
             uVar56 + uVar30 + ((uVar79 ^ uVar112) & uVar106 ^ uVar112) + 0x106aa070;
    uVar75 = uVar75 + iVar23;
    uVar56 = ((uVar111 ^ uVar90) & uVar93 ^ uVar111 & uVar90) +
             ((uVar93 * 0x400 | uVar93 >> 0x16) ^
             (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar23;
    uVar100 = (uVar26 >> 3 ^ (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)
              ) + uVar69 + uVar96 +
              (uVar19 >> 10 ^
              (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
    iVar23 = ((uVar75 * 0x80 | uVar75 >> 0x19) ^
             (uVar75 * 0x200000 | uVar75 >> 0xb) ^ (uVar75 * 0x4000000 | uVar75 >> 6)) +
             uVar112 + uVar100 + ((uVar106 ^ uVar79) & uVar75 ^ uVar79) + 0x19a4c116;
    uVar90 = uVar90 + iVar23;
    uVar112 = ((uVar93 ^ uVar111) & uVar56 ^ uVar93 & uVar111) +
              ((uVar56 * 0x400 | uVar56 >> 0x16) ^
              (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar23;
    uVar20 = (uVar76 >> 3 ^ (uVar76 * 0x4000 | uVar76 >> 0x12) ^ (uVar76 * 0x2000000 | uVar76 >> 7))
             + uVar26 + uVar41 +
             (uVar30 >> 10 ^ (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11)
             );
    iVar23 = ((uVar90 * 0x80 | uVar90 >> 0x19) ^
             (uVar90 * 0x200000 | uVar90 >> 0xb) ^ (uVar90 * 0x4000000 | uVar90 >> 6)) +
             uVar79 + uVar20 + ((uVar75 ^ uVar106) & uVar90 ^ uVar106) + 0x1e376c08;
    uVar111 = uVar111 + iVar23;
    uVar26 = ((uVar56 ^ uVar93) & uVar112 ^ uVar56 & uVar93) +
             ((uVar112 * 0x400 | uVar112 >> 0x16) ^
             (uVar112 * 0x80000 | uVar112 >> 0xd) ^ (uVar112 * 0x40000000 | uVar112 >> 2)) + iVar23;
    uVar24 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7))
             + uVar76 + uVar102 +
             (uVar100 >> 10 ^
             (uVar100 * 0x2000 | uVar100 >> 0x13) ^ (uVar100 * 0x8000 | uVar100 >> 0x11));
    iVar23 = ((uVar111 * 0x80 | uVar111 >> 0x19) ^
             (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6)) +
             uVar106 + uVar24 + ((uVar90 ^ uVar75) & uVar111 ^ uVar75) + 0x2748774c;
    uVar93 = uVar93 + iVar23;
    uVar106 = ((uVar112 ^ uVar56) & uVar26 ^ uVar112 & uVar56) +
              ((uVar26 * 0x400 | uVar26 >> 0x16) ^
              (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar23;
    uVar84 = (uVar31 >> 3 ^ (uVar31 * 0x4000 | uVar31 >> 0x12) ^ (uVar31 * 0x2000000 | uVar31 >> 7))
             + uVar18 + uVar105 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    iVar23 = ((uVar93 * 0x80 | uVar93 >> 0x19) ^
             (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6)) +
             uVar75 + uVar84 + ((uVar111 ^ uVar90) & uVar93 ^ uVar90) + 0x34b0bcb5;
    uVar56 = uVar56 + iVar23;
    uVar74 = ((uVar26 ^ uVar112) & uVar106 ^ uVar26 & uVar112) +
             ((uVar106 * 0x400 | uVar106 >> 0x16) ^
             (uVar106 * 0x80000 | uVar106 >> 0xd) ^ (uVar106 * 0x40000000 | uVar106 >> 2)) + iVar23;
    uVar25 = (uVar99 >> 3 ^ (uVar99 * 0x4000 | uVar99 >> 0x12) ^ (uVar99 * 0x2000000 | uVar99 >> 7))
             + uVar31 + uVar98 +
             (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11)
             );
    iVar23 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
             (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
             uVar90 + uVar25 + ((uVar93 ^ uVar111) & uVar56 ^ uVar111) + 0x391c0cb3;
    uVar112 = uVar112 + iVar23;
    uVar90 = ((uVar106 ^ uVar26) & uVar74 ^ uVar106 & uVar26) +
             ((uVar74 * 0x400 | uVar74 >> 0x16) ^
             (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar23;
    uVar75 = (uVar17 >> 3 ^ (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7))
             + uVar99 + uVar19 +
             (uVar84 >> 10 ^ (uVar84 * 0x2000 | uVar84 >> 0x13) ^ (uVar84 * 0x8000 | uVar84 >> 0x11)
             );
    iVar23 = ((uVar112 * 0x80 | uVar112 >> 0x19) ^
             (uVar112 * 0x200000 | uVar112 >> 0xb) ^ (uVar112 * 0x4000000 | uVar112 >> 6)) +
             uVar111 + uVar75 + ((uVar56 ^ uVar93) & uVar112 ^ uVar93) + 0x4ed8aa4a;
    uVar26 = uVar26 + iVar23;
    uVar79 = ((uVar74 ^ uVar106) & uVar90 ^ uVar74 & uVar106) +
             ((uVar90 * 0x400 | uVar90 >> 0x16) ^
             (uVar90 * 0x80000 | uVar90 >> 0xd) ^ (uVar90 * 0x40000000 | uVar90 >> 2)) + iVar23;
    uVar69 = (uVar37 >> 3 ^ (uVar37 * 0x4000 | uVar37 >> 0x12) ^ (uVar37 * 0x2000000 | uVar37 >> 7))
             + uVar17 + uVar30 +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    iVar23 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
             uVar93 + uVar69 + ((uVar112 ^ uVar56) & uVar26 ^ uVar56) + 0x5b9cca4f;
    uVar106 = uVar106 + iVar23;
    uVar93 = ((uVar90 ^ uVar74) & uVar79 ^ uVar90 & uVar74) +
             ((uVar79 * 0x400 | uVar79 >> 0x16) ^
             (uVar79 * 0x80000 | uVar79 >> 0xd) ^ (uVar79 * 0x40000000 | uVar79 >> 2)) + iVar23;
    uVar111 = (uVar108 >> 3 ^
              (uVar108 * 0x4000 | uVar108 >> 0x12) ^ (uVar108 * 0x2000000 | uVar108 >> 7)) + uVar37
              + uVar100 +
              (uVar75 >> 10 ^
              (uVar75 * 0x2000 | uVar75 >> 0x13) ^ (uVar75 * 0x8000 | uVar75 >> 0x11));
    iVar23 = ((uVar106 * 0x80 | uVar106 >> 0x19) ^
             (uVar106 * 0x200000 | uVar106 >> 0xb) ^ (uVar106 * 0x4000000 | uVar106 >> 6)) +
             uVar56 + uVar111 + ((uVar26 ^ uVar112) & uVar106 ^ uVar112) + 0x682e6ff3;
    uVar74 = uVar74 + iVar23;
    uVar37 = ((uVar79 ^ uVar90) & uVar93 ^ uVar79 & uVar90) +
             ((uVar93 * 0x400 | uVar93 >> 0x16) ^
             (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar23;
    uVar108 = (uVar96 >> 3 ^ (uVar96 * 0x4000 | uVar96 >> 0x12) ^ (uVar96 * 0x2000000 | uVar96 >> 7)
              ) + uVar108 + uVar20 +
              (uVar69 >> 10 ^
              (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11));
    iVar23 = ((uVar74 * 0x80 | uVar74 >> 0x19) ^
             (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) +
             uVar112 + uVar108 + ((uVar106 ^ uVar26) & uVar74 ^ uVar26) + 0x748f82ee;
    uVar90 = uVar90 + iVar23;
    uVar76 = ((uVar93 ^ uVar79) & uVar37 ^ uVar93 & uVar79) +
             ((uVar37 * 0x400 | uVar37 >> 0x16) ^
             (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar23;
    uVar24 = (uVar41 >> 3 ^ (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7))
             + uVar96 + uVar24 +
             (uVar111 >> 10 ^
             (uVar111 * 0x2000 | uVar111 >> 0x13) ^ (uVar111 * 0x8000 | uVar111 >> 0x11));
    iVar23 = ((uVar90 * 0x80 | uVar90 >> 0x19) ^
             (uVar90 * 0x200000 | uVar90 >> 0xb) ^ (uVar90 * 0x4000000 | uVar90 >> 6)) +
             uVar26 + uVar24 + ((uVar74 ^ uVar106) & uVar90 ^ uVar106) + 0x78a5636f;
    uVar79 = uVar79 + iVar23;
    uVar56 = ((uVar37 ^ uVar93) & uVar76 ^ uVar37 & uVar93) +
             ((uVar76 * 0x400 | uVar76 >> 0x16) ^
             (uVar76 * 0x80000 | uVar76 >> 0xd) ^ (uVar76 * 0x40000000 | uVar76 >> 2)) + iVar23;
    uVar20 = (uVar102 >> 3 ^
             (uVar102 * 0x4000 | uVar102 >> 0x12) ^ (uVar102 * 0x2000000 | uVar102 >> 7)) + uVar41 +
             uVar84 + (uVar108 >> 10 ^
                      (uVar108 * 0x2000 | uVar108 >> 0x13) ^ (uVar108 * 0x8000 | uVar108 >> 0x11));
    iVar23 = ((uVar79 * 0x80 | uVar79 >> 0x19) ^
             (uVar79 * 0x200000 | uVar79 >> 0xb) ^ (uVar79 * 0x4000000 | uVar79 >> 6)) +
             uVar106 + uVar20 + ((uVar90 ^ uVar74) & uVar79 ^ uVar74) + -0x7b3787ec;
    uVar93 = uVar93 + iVar23;
    uVar84 = ((uVar76 ^ uVar37) & uVar56 ^ uVar76 & uVar37) +
             ((uVar56 * 0x400 | uVar56 >> 0x16) ^
             (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar23;
    uVar24 = (uVar105 >> 3 ^
             (uVar105 * 0x4000 | uVar105 >> 0x12) ^ (uVar105 * 0x2000000 | uVar105 >> 7)) + uVar102
             + uVar25 +
             (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11)
             );
    iVar23 = ((uVar93 * 0x80 | uVar93 >> 0x19) ^
             (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6)) +
             uVar74 + uVar24 + ((uVar79 ^ uVar90) & uVar93 ^ uVar90) + -0x7338fdf8;
    uVar37 = uVar37 + iVar23;
    uVar74 = ((uVar56 ^ uVar76) & uVar84 ^ uVar56 & uVar76) +
             ((uVar84 * 0x400 | uVar84 >> 0x16) ^
             (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar23;
    uVar20 = (uVar98 >> 3 ^ (uVar98 * 0x4000 | uVar98 >> 0x12) ^ (uVar98 * 0x2000000 | uVar98 >> 7))
             + uVar105 + uVar75 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    iVar23 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
             (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
             uVar90 + uVar20 + ((uVar93 ^ uVar79) & uVar37 ^ uVar79) + -0x6f410006;
    uVar76 = uVar76 + iVar23;
    uVar75 = ((uVar84 ^ uVar56) & uVar74 ^ uVar84 & uVar56) +
             ((uVar74 * 0x400 | uVar74 >> 0x16) ^
             (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar23;
    uVar96 = (uVar19 >> 3 ^ (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7))
             + uVar98 + uVar69 +
             (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11)
             );
    iVar23 = ((uVar76 * 0x80 | uVar76 >> 0x19) ^
             (uVar76 * 0x200000 | uVar76 >> 0xb) ^ (uVar76 * 0x4000000 | uVar76 >> 6)) +
             uVar79 + uVar96 + ((uVar37 ^ uVar93) & uVar76 ^ uVar93) + -0x5baf9315;
    uVar56 = uVar56 + iVar23;
    uVar24 = ((uVar74 ^ uVar84) & uVar75 ^ uVar74 & uVar84) +
             ((uVar75 * 0x400 | uVar75 >> 0x16) ^
             (uVar75 * 0x80000 | uVar75 >> 0xd) ^ (uVar75 * 0x40000000 | uVar75 >> 2)) + iVar23;
    iVar23 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
             (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
             (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7))
             + uVar19 + uVar111 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             ) + uVar93 + ((uVar76 ^ uVar37) & uVar56 ^ uVar37) + -0x41065c09;
    uVar84 = uVar84 + iVar23;
    uVar20 = ((uVar75 ^ uVar74) & uVar24 ^ uVar75 & uVar74) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar23;
    iVar23 = ((uVar84 * 0x80 | uVar84 >> 0x19) ^
             (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6)) +
             (uVar100 >> 3 ^
             (uVar100 * 0x4000 | uVar100 >> 0x12) ^ (uVar100 * 0x2000000 | uVar100 >> 7)) + uVar30 +
             uVar108 + (uVar96 >> 10 ^
                       (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11)) +
             uVar37 + ((uVar56 ^ uVar76) & uVar84 ^ uVar76) + -0x398e870e;
    (s->digest).i32[0] =
         ((uVar24 ^ uVar75) & uVar20 ^ uVar24 & uVar75) + uVar1 +
         ((uVar20 * 0x400 | uVar20 >> 0x16) ^
         (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar23;
    (s->digest).i32[1] = uVar20 + uVar2;
    (s->digest).i32[2] = uVar24 + uVar3;
    (s->digest).i32[3] = uVar75 + uVar8;
    (s->digest).i32[4] = uVar74 + uVar4 + iVar23;
    (s->digest).i32[5] = uVar84 + uVar5;
    (s->digest).i32[6] = uVar56 + uVar6;
    (s->digest).i32[7] = uVar76 + uVar7;
  }
  else {
    uVar9 = (s->digest).i64[0];
    uVar10 = (s->digest).i64[1];
    uVar11 = (s->digest).i64[2];
    uVar12 = (s->digest).i64[3];
    uVar13 = (s->digest).i64[4];
    uVar14 = (s->digest).i64[5];
    uVar15 = (s->digest).i64[6];
    uVar16 = (s->digest).i64[7];
    uVar27 = (ulong)data[7] |
             (ulong)data[6] << 8 |
             (ulong)data[5] << 0x10 |
             (ulong)data[4] << 0x18 |
             (ulong)data[3] << 0x20 |
             (ulong)data[2] << 0x28 | (ulong)data[1] << 0x30 | (ulong)*data << 0x38;
    lVar28 = ((uVar14 ^ uVar15) & uVar13 ^ uVar15) + uVar16 +
             ((uVar13 << 0x17 | uVar13 >> 0x29) ^
             (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe)) +
             0x428a2f98d728ae22 + uVar27;
    uVar21 = (uVar11 & uVar10 ^ (uVar11 ^ uVar10) & uVar9) +
             ((uVar9 << 0x19 | uVar9 >> 0x27) ^
             (uVar9 << 0x1e | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar28;
    uVar29 = lVar28 + uVar12;
    uVar66 = *(ulong *)(data + 8);
    uVar40 = uVar66 >> 0x38;
    uVar42 = uVar40 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar13 ^ uVar14) & uVar29 ^ uVar14) + uVar15 + uVar42 +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe)) +
             0x7137449123ef65cd;
    uVar80 = ((uVar10 ^ uVar9) & uVar21 ^ uVar10 & uVar9) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar32 = lVar28 + uVar11;
    uVar66 = *(ulong *)(data + 0x10);
    uVar82 = uVar66 >> 0x38;
    uVar70 = uVar82 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar29 ^ uVar13) & uVar32 ^ uVar13) + uVar14 + uVar70 +
             ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
             (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe)) +
             -0x4a3f043013b2c4d1;
    uVar38 = ((uVar21 ^ uVar9) & uVar80 ^ uVar21 & uVar9) +
             ((uVar80 * 0x2000000 | uVar80 >> 0x27) ^
             (uVar80 * 0x40000000 | uVar80 >> 0x22) ^ (uVar80 << 0x24 | uVar80 >> 0x1c)) + lVar28;
    uVar94 = lVar28 + uVar10;
    uVar66 = *(ulong *)(data + 0x18);
    uVar87 = uVar66 >> 0x38;
    uVar57 = uVar87 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar32 ^ uVar29) & uVar94 ^ uVar29) + uVar13 + uVar57 +
             ((uVar94 * 0x800000 | uVar94 >> 0x29) ^
             (uVar94 << 0x2e | uVar94 >> 0x12) ^ (uVar94 << 0x32 | uVar94 >> 0xe)) +
             -0x164a245a7e762444;
    uVar86 = ((uVar80 ^ uVar21) & uVar38 ^ uVar80 & uVar21) +
             ((uVar38 * 0x2000000 | uVar38 >> 0x27) ^
             (uVar38 * 0x40000000 | uVar38 >> 0x22) ^ (uVar38 << 0x24 | uVar38 >> 0x1c)) + lVar28;
    uVar91 = lVar28 + uVar9;
    uVar66 = *(ulong *)(data + 0x20);
    uVar83 = uVar66 >> 0x38;
    uVar58 = uVar83 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar94 ^ uVar32) & uVar91 ^ uVar32) + uVar29 + uVar58 +
             ((uVar91 * 0x800000 | uVar91 >> 0x29) ^
             (uVar91 << 0x2e | uVar91 >> 0x12) ^ (uVar91 << 0x32 | uVar91 >> 0xe)) +
             0x3956c25bf348b538;
    uVar21 = uVar21 + lVar28;
    uVar29 = ((uVar38 ^ uVar80) & uVar86 ^ uVar38 & uVar80) +
             ((uVar86 * 0x2000000 | uVar86 >> 0x27) ^
             (uVar86 * 0x40000000 | uVar86 >> 0x22) ^ (uVar86 << 0x24 | uVar86 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x28);
    uVar44 = uVar66 >> 0x38;
    uVar33 = uVar44 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar91 ^ uVar94) & uVar21 ^ uVar94) + uVar32 + uVar33 +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe)) +
             0x59f111f1b605d019;
    uVar80 = uVar80 + lVar28;
    uVar34 = ((uVar86 ^ uVar38) & uVar29 ^ uVar86 & uVar38) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x30);
    uVar32 = uVar66 >> 0x38;
    uVar59 = uVar32 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar21 ^ uVar91) & uVar80 ^ uVar91) + uVar94 + uVar59 +
             ((uVar80 * 0x800000 | uVar80 >> 0x29) ^
             (uVar80 << 0x2e | uVar80 >> 0x12) ^ (uVar80 << 0x32 | uVar80 >> 0xe)) +
             -0x6dc07d5b50e6b065;
    uVar38 = uVar38 + lVar28;
    uVar95 = ((uVar29 ^ uVar86) & uVar34 ^ uVar29 & uVar86) +
             ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
             (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x38);
    uVar94 = uVar66 >> 0x38;
    uVar60 = uVar94 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar80 ^ uVar21) & uVar38 ^ uVar21) + uVar91 + uVar60 +
             ((uVar38 * 0x800000 | uVar38 >> 0x29) ^
             (uVar38 << 0x2e | uVar38 >> 0x12) ^ (uVar38 << 0x32 | uVar38 >> 0xe)) +
             -0x54e3a12a25927ee8;
    uVar86 = uVar86 + lVar28;
    uVar92 = ((uVar34 ^ uVar29) & uVar95 ^ uVar34 & uVar29) +
             ((uVar95 * 0x2000000 | uVar95 >> 0x27) ^
             (uVar95 * 0x40000000 | uVar95 >> 0x22) ^ (uVar95 << 0x24 | uVar95 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x40);
    uVar91 = uVar66 >> 0x38;
    uVar61 = uVar91 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar38 ^ uVar80) & uVar86 ^ uVar80) + uVar21 + uVar61 +
             ((uVar86 * 0x800000 | uVar86 >> 0x29) ^
             (uVar86 << 0x2e | uVar86 >> 0x12) ^ (uVar86 << 0x32 | uVar86 >> 0xe)) +
             -0x27f855675cfcfdbe;
    uVar29 = uVar29 + lVar28;
    uVar107 = ((uVar95 ^ uVar34) & uVar92 ^ uVar95 & uVar34) +
              ((uVar92 * 0x2000000 | uVar92 >> 0x27) ^
              (uVar92 * 0x40000000 | uVar92 >> 0x22) ^ (uVar92 << 0x24 | uVar92 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x48);
    uVar72 = uVar66 >> 0x38;
    uVar62 = uVar72 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar86 ^ uVar38) & uVar29 ^ uVar38) + uVar80 + uVar62 +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe)) +
             0x12835b0145706fbe;
    uVar34 = uVar34 + lVar28;
    uVar22 = ((uVar92 ^ uVar95) & uVar107 ^ uVar92 & uVar95) +
             ((uVar107 * 0x2000000 | uVar107 >> 0x27) ^
             (uVar107 * 0x40000000 | uVar107 >> 0x22) ^ (uVar107 << 0x24 | uVar107 >> 0x1c)) +
             lVar28;
    uVar66 = *(ulong *)(data + 0x50);
    uVar80 = uVar66 >> 0x38;
    uVar63 = uVar80 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar29 ^ uVar86) & uVar34 ^ uVar86) + uVar38 + uVar63 +
             ((uVar34 * 0x800000 | uVar34 >> 0x29) ^
             (uVar34 << 0x2e | uVar34 >> 0x12) ^ (uVar34 << 0x32 | uVar34 >> 0xe)) +
             0x243185be4ee4b28c;
    uVar95 = uVar95 + lVar28;
    uVar81 = ((uVar107 ^ uVar92) & uVar22 ^ uVar107 & uVar92) +
             ((uVar22 * 0x2000000 | uVar22 >> 0x27) ^
             (uVar22 * 0x40000000 | uVar22 >> 0x22) ^ (uVar22 << 0x24 | uVar22 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x58);
    uVar38 = uVar66 >> 0x38;
    uVar64 = uVar38 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar34 ^ uVar29) & uVar95 ^ uVar29) + uVar86 + uVar64 +
             ((uVar95 * 0x800000 | uVar95 >> 0x29) ^
             (uVar95 << 0x2e | uVar95 >> 0x12) ^ (uVar95 << 0x32 | uVar95 >> 0xe)) +
             0x550c7dc3d5ffb4e2;
    uVar92 = uVar92 + lVar28;
    uVar103 = ((uVar22 ^ uVar107) & uVar81 ^ uVar22 & uVar107) +
              ((uVar81 * 0x2000000 | uVar81 >> 0x27) ^
              (uVar81 * 0x40000000 | uVar81 >> 0x22) ^ (uVar81 << 0x24 | uVar81 >> 0x1c)) + lVar28;
    uVar66 = *(ulong *)(data + 0x60);
    uVar86 = uVar66 >> 0x38;
    uVar65 = uVar86 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar95 ^ uVar34) & uVar92 ^ uVar34) + uVar29 + uVar65 +
             ((uVar92 * 0x800000 | uVar92 >> 0x29) ^
             (uVar92 << 0x2e | uVar92 >> 0x12) ^ (uVar92 << 0x32 | uVar92 >> 0xe)) +
             0x72be5d74f27b896f;
    uVar107 = uVar107 + lVar28;
    uVar39 = ((uVar81 ^ uVar22) & uVar103 ^ uVar81 & uVar22) +
             ((uVar103 * 0x2000000 | uVar103 >> 0x27) ^
             (uVar103 * 0x40000000 | uVar103 >> 0x22) ^ (uVar103 << 0x24 | uVar103 >> 0x1c)) +
             lVar28;
    uVar66 = *(ulong *)(data + 0x68);
    uVar101 = uVar66 >> 0x38;
    uVar35 = uVar101 | (uVar66 & 0xff000000000000) >> 0x28 | (uVar66 & 0xff0000000000) >> 0x18 |
             (uVar66 & 0xff00000000) >> 8 | (uVar66 & 0xff000000) << 8 | (uVar66 & 0xff0000) << 0x18
             | (uVar66 & 0xff00) << 0x28 | uVar66 << 0x38;
    lVar28 = ((uVar92 ^ uVar95) & uVar107 ^ uVar95) + uVar34 + uVar35 +
             ((uVar107 * 0x800000 | uVar107 >> 0x29) ^
             (uVar107 << 0x2e | uVar107 >> 0x12) ^ (uVar107 << 0x32 | uVar107 >> 0xe)) +
             -0x7f214e01c4e9694f;
    uVar22 = uVar22 + lVar28;
    uVar66 = ((uVar103 ^ uVar81) & uVar39 ^ uVar103 & uVar81) +
             ((uVar39 * 0x2000000 | uVar39 >> 0x27) ^
             (uVar39 * 0x40000000 | uVar39 >> 0x22) ^ (uVar39 << 0x24 | uVar39 >> 0x1c)) + lVar28;
    uVar21 = *(ulong *)(data + 0x70);
    uVar34 = uVar21 >> 0x38;
    uVar43 = uVar34 | (uVar21 & 0xff000000000000) >> 0x28 | (uVar21 & 0xff0000000000) >> 0x18;
    uVar113 = uVar43 | (uVar21 & 0xff00000000) >> 8 | (uVar21 & 0xff000000) << 8 |
              (uVar21 & 0xff0000) << 0x18 | (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
    lVar28 = ((uVar107 ^ uVar92) & uVar22 ^ uVar92) + uVar95 + uVar113 +
             ((uVar22 * 0x800000 | uVar22 >> 0x29) ^
             (uVar22 << 0x2e | uVar22 >> 0x12) ^ (uVar22 << 0x32 | uVar22 >> 0xe)) +
             -0x6423f958da38edcb;
    uVar81 = uVar81 + lVar28;
    uVar67 = ((uVar39 ^ uVar103) & uVar66 ^ uVar39 & uVar103) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar29 = *(ulong *)(data + 0x78);
    uVar95 = uVar29 >> 0x38;
    uVar71 = uVar95 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18;
    uVar36 = uVar71 | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 |
             (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
    lVar28 = ((uVar22 ^ uVar107) & uVar81 ^ uVar107) + uVar92 + uVar36 +
             ((uVar81 * 0x800000 | uVar81 >> 0x29) ^
             (uVar81 << 0x2e | uVar81 >> 0x12) ^ (uVar81 << 0x32 | uVar81 >> 0xe)) +
             -0x3e640e8b3096d96c;
    uVar103 = uVar103 + lVar28;
    uVar92 = ((uVar66 ^ uVar39) & uVar67 ^ uVar66 & uVar39) +
             ((uVar67 * 0x2000000 | uVar67 >> 0x27) ^
             (uVar67 * 0x40000000 | uVar67 >> 0x22) ^ (uVar67 << 0x24 | uVar67 >> 0x1c)) + lVar28;
    uVar27 = (uVar42 >> 7 ^
             (uVar40 << 0x38 | uVar42 >> 8) ^ (uVar42 >> 1 | (ulong)((uVar40 & 1) != 0) << 0x3f)) +
             uVar62 + (uVar113 >> 6 ^
                      (uVar113 << 3 | (uVar21 << 0x38) >> 0x3d) ^ (uVar43 << 0x2d | uVar113 >> 0x13)
                      ) + uVar27;
    lVar28 = uVar107 + uVar27 + ((uVar81 ^ uVar22) & uVar103 ^ uVar22) + -0x1b64963e610eb52e +
             ((uVar103 * 0x800000 | uVar103 >> 0x29) ^
             (uVar103 << 0x2e | uVar103 >> 0x12) ^ (uVar103 << 0x32 | uVar103 >> 0xe));
    uVar39 = uVar39 + lVar28;
    uVar21 = ((uVar67 ^ uVar66) & uVar92 ^ uVar67 & uVar66) +
             ((uVar92 * 0x2000000 | uVar92 >> 0x27) ^
             (uVar92 * 0x40000000 | uVar92 >> 0x22) ^ (uVar92 << 0x24 | uVar92 >> 0x1c)) + lVar28;
    uVar43 = uVar42 + uVar63 +
             (uVar70 >> 7 ^
             (uVar82 << 0x38 | uVar70 >> 8) ^ (uVar70 >> 1 | (ulong)((uVar82 & 1) != 0) << 0x3f)) +
             (uVar36 >> 6 ^
             (uVar36 << 3 | (uVar29 << 0x38) >> 0x3d) ^ (uVar71 << 0x2d | uVar36 >> 0x13));
    lVar28 = uVar22 + uVar43 + ((uVar103 ^ uVar81) & uVar39 ^ uVar81) + -0x1041b879c7b0da1d +
             ((uVar39 * 0x800000 | uVar39 >> 0x29) ^
             (uVar39 << 0x2e | uVar39 >> 0x12) ^ (uVar39 << 0x32 | uVar39 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar107 = ((uVar92 ^ uVar67) & uVar21 ^ uVar92 & uVar67) +
              ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
              (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar70 = uVar70 + uVar64 +
             (uVar57 >> 7 ^
             (uVar87 << 0x38 | uVar57 >> 8) ^ (uVar57 >> 1 | (ulong)((uVar87 & 1) != 0) << 0x3f)) +
             (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
    lVar28 = uVar81 + uVar70 + ((uVar39 ^ uVar103) & uVar66 ^ uVar103) + 0xfc19dc68b8cd5b5 +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar67 = uVar67 + lVar28;
    uVar82 = ((uVar21 ^ uVar92) & uVar107 ^ uVar21 & uVar92) +
             ((uVar107 * 0x2000000 | uVar107 >> 0x27) ^
             (uVar107 * 0x40000000 | uVar107 >> 0x22) ^ (uVar107 << 0x24 | uVar107 >> 0x1c)) +
             lVar28;
    uVar81 = uVar57 + uVar65 +
             (uVar58 >> 7 ^
             (uVar83 << 0x38 | uVar58 >> 8) ^ (uVar58 >> 1 | (ulong)((uVar83 & 1) != 0) << 0x3f)) +
             (uVar43 >> 6 ^ (uVar43 * 8 | uVar43 >> 0x3d) ^ (uVar43 << 0x2d | uVar43 >> 0x13));
    lVar28 = uVar103 + uVar81 + ((uVar66 ^ uVar39) & uVar67 ^ uVar39) + 0x240ca1cc77ac9c65 +
             ((uVar67 * 0x800000 | uVar67 >> 0x29) ^
             (uVar67 << 0x2e | uVar67 >> 0x12) ^ (uVar67 << 0x32 | uVar67 >> 0xe));
    uVar92 = uVar92 + lVar28;
    uVar22 = ((uVar107 ^ uVar21) & uVar82 ^ uVar107 & uVar21) +
             ((uVar82 * 0x2000000 | uVar82 >> 0x27) ^
             (uVar82 * 0x40000000 | uVar82 >> 0x22) ^ (uVar82 << 0x24 | uVar82 >> 0x1c)) + lVar28;
    uVar42 = uVar58 + uVar35 +
             (uVar33 >> 7 ^
             (uVar44 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar44 & 1) != 0) << 0x3f)) +
             (uVar70 >> 6 ^ (uVar70 * 8 | uVar70 >> 0x3d) ^ (uVar70 << 0x2d | uVar70 >> 0x13));
    lVar28 = uVar39 + uVar42 + ((uVar67 ^ uVar66) & uVar92 ^ uVar66) + 0x2de92c6f592b0275 +
             ((uVar92 * 0x800000 | uVar92 >> 0x29) ^
             (uVar92 << 0x2e | uVar92 >> 0x12) ^ (uVar92 << 0x32 | uVar92 >> 0xe));
    uVar21 = uVar21 + lVar28;
    uVar40 = ((uVar82 ^ uVar107) & uVar22 ^ uVar82 & uVar107) +
             ((uVar22 * 0x2000000 | uVar22 >> 0x27) ^
             (uVar22 * 0x40000000 | uVar22 >> 0x22) ^ (uVar22 << 0x24 | uVar22 >> 0x1c)) + lVar28;
    uVar58 = uVar33 + uVar113 +
             (uVar59 >> 7 ^
             (uVar32 << 0x38 | uVar59 >> 8) ^ (uVar59 >> 1 | (ulong)((uVar32 & 1) != 0) << 0x3f)) +
             (uVar81 >> 6 ^ (uVar81 * 8 | uVar81 >> 0x3d) ^ (uVar81 << 0x2d | uVar81 >> 0x13));
    lVar28 = uVar66 + uVar58 + ((uVar92 ^ uVar67) & uVar21 ^ uVar67) + 0x4a7484aa6ea6e483 +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar107 = uVar107 + lVar28;
    uVar29 = ((uVar22 ^ uVar82) & uVar40 ^ uVar22 & uVar82) +
             ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
             (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar28;
    uVar71 = uVar59 + uVar36 +
             (uVar60 >> 7 ^
             (uVar94 << 0x38 | uVar60 >> 8) ^ (uVar60 >> 1 | (ulong)((uVar94 & 1) != 0) << 0x3f)) +
             (uVar42 >> 6 ^ (uVar42 * 8 | uVar42 >> 0x3d) ^ (uVar42 << 0x2d | uVar42 >> 0x13));
    lVar28 = uVar67 + uVar71 + ((uVar21 ^ uVar92) & uVar107 ^ uVar92) + 0x5cb0a9dcbd41fbd4 +
             ((uVar107 * 0x800000 | uVar107 >> 0x29) ^
             (uVar107 << 0x2e | uVar107 >> 0x12) ^ (uVar107 << 0x32 | uVar107 >> 0xe));
    uVar82 = uVar82 + lVar28;
    uVar87 = ((uVar40 ^ uVar22) & uVar29 ^ uVar40 & uVar22) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar44 = (uVar61 >> 7 ^
             (uVar91 << 0x38 | uVar61 >> 8) ^ (uVar61 >> 1 | (ulong)((uVar91 & 1) != 0) << 0x3f)) +
             uVar60 + uVar27 +
             (uVar58 >> 6 ^ (uVar58 * 8 | uVar58 >> 0x3d) ^ (uVar58 << 0x2d | uVar58 >> 0x13));
    lVar28 = uVar92 + uVar44 + ((uVar107 ^ uVar21) & uVar82 ^ uVar21) + 0x76f988da831153b5 +
             ((uVar82 * 0x800000 | uVar82 >> 0x29) ^
             (uVar82 << 0x2e | uVar82 >> 0x12) ^ (uVar82 << 0x32 | uVar82 >> 0xe));
    uVar22 = uVar22 + lVar28;
    uVar32 = ((uVar29 ^ uVar40) & uVar87 ^ uVar29 & uVar40) +
             ((uVar87 * 0x2000000 | uVar87 >> 0x27) ^
             (uVar87 * 0x40000000 | uVar87 >> 0x22) ^ (uVar87 << 0x24 | uVar87 >> 0x1c)) + lVar28;
    uVar39 = (uVar62 >> 7 ^
             (uVar72 << 0x38 | uVar62 >> 8) ^ (uVar62 >> 1 | (ulong)((uVar72 & 1) != 0) << 0x3f)) +
             uVar61 + uVar43 +
             (uVar71 >> 6 ^ (uVar71 * 8 | uVar71 >> 0x3d) ^ (uVar71 << 0x2d | uVar71 >> 0x13));
    lVar28 = uVar21 + uVar39 + ((uVar82 ^ uVar107) & uVar22 ^ uVar107) + -0x67c1aead11992055 +
             ((uVar22 * 0x800000 | uVar22 >> 0x29) ^
             (uVar22 << 0x2e | uVar22 >> 0x12) ^ (uVar22 << 0x32 | uVar22 >> 0xe));
    uVar40 = uVar40 + lVar28;
    uVar59 = ((uVar87 ^ uVar29) & uVar32 ^ uVar87 & uVar29) +
             ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
             (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar28;
    uVar91 = (uVar63 >> 7 ^
             (uVar80 << 0x38 | uVar63 >> 8) ^ (uVar63 >> 1 | (ulong)((uVar80 & 1) != 0) << 0x3f)) +
             uVar62 + uVar70 +
             (uVar44 >> 6 ^ (uVar44 * 8 | uVar44 >> 0x3d) ^ (uVar44 << 0x2d | uVar44 >> 0x13));
    lVar28 = uVar107 + uVar91 + ((uVar22 ^ uVar82) & uVar40 ^ uVar82) + -0x57ce3992d24bcdf0 +
             ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
             (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
    uVar29 = uVar29 + lVar28;
    uVar21 = ((uVar32 ^ uVar87) & uVar59 ^ uVar32 & uVar87) +
             ((uVar59 * 0x2000000 | uVar59 >> 0x27) ^
             (uVar59 * 0x40000000 | uVar59 >> 0x22) ^ (uVar59 << 0x24 | uVar59 >> 0x1c)) + lVar28;
    uVar57 = (uVar64 >> 7 ^
             (uVar38 << 0x38 | uVar64 >> 8) ^ (uVar64 >> 1 | (ulong)((uVar38 & 1) != 0) << 0x3f)) +
             uVar63 + uVar81 +
             (uVar39 >> 6 ^ (uVar39 * 8 | uVar39 >> 0x3d) ^ (uVar39 << 0x2d | uVar39 >> 0x13));
    lVar28 = uVar82 + uVar57 + ((uVar40 ^ uVar22) & uVar29 ^ uVar22) + -0x4ffcd8376704dec1 +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
    uVar87 = uVar87 + lVar28;
    uVar83 = ((uVar59 ^ uVar32) & uVar21 ^ uVar59 & uVar32) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar33 = (uVar65 >> 7 ^
             (uVar86 << 0x38 | uVar65 >> 8) ^ (uVar65 >> 1 | (ulong)((uVar86 & 1) != 0) << 0x3f)) +
             uVar64 + uVar42 +
             (uVar91 >> 6 ^ (uVar91 * 8 | uVar91 >> 0x3d) ^ (uVar91 << 0x2d | uVar91 >> 0x13));
    lVar28 = uVar22 + uVar33 + ((uVar29 ^ uVar40) & uVar87 ^ uVar40) + -0x40a680384110f11c +
             ((uVar87 * 0x800000 | uVar87 >> 0x29) ^
             (uVar87 << 0x2e | uVar87 >> 0x12) ^ (uVar87 << 0x32 | uVar87 >> 0xe));
    uVar32 = uVar32 + lVar28;
    uVar80 = ((uVar21 ^ uVar59) & uVar83 ^ uVar21 & uVar59) +
             ((uVar83 * 0x2000000 | uVar83 >> 0x27) ^
             (uVar83 * 0x40000000 | uVar83 >> 0x22) ^ (uVar83 << 0x24 | uVar83 >> 0x1c)) + lVar28;
    uVar22 = (uVar35 >> 7 ^
             (uVar101 << 0x38 | uVar35 >> 8) ^ (uVar35 >> 1 | (ulong)((uVar101 & 1) != 0) << 0x3f))
             + uVar65 + uVar58 +
             (uVar57 >> 6 ^ (uVar57 * 8 | uVar57 >> 0x3d) ^ (uVar57 << 0x2d | uVar57 >> 0x13));
    lVar28 = uVar40 + uVar22 + ((uVar87 ^ uVar29) & uVar32 ^ uVar29) + -0x391ff40cc257703e +
             ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
             (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
    uVar59 = uVar59 + lVar28;
    uVar66 = ((uVar83 ^ uVar21) & uVar80 ^ uVar83 & uVar21) +
             ((uVar80 * 0x2000000 | uVar80 >> 0x27) ^
             (uVar80 * 0x40000000 | uVar80 >> 0x22) ^ (uVar80 << 0x24 | uVar80 >> 0x1c)) + lVar28;
    uVar40 = (uVar113 >> 7 ^
             (uVar34 << 0x38 | uVar113 >> 8) ^ (uVar113 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f))
             + uVar35 + uVar71 +
             (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13));
    lVar28 = uVar29 + uVar40 + ((uVar32 ^ uVar87) & uVar59 ^ uVar87) + -0x2a586eb86cf558db +
             ((uVar59 * 0x800000 | uVar59 >> 0x29) ^
             (uVar59 << 0x2e | uVar59 >> 0x12) ^ (uVar59 << 0x32 | uVar59 >> 0xe));
    uVar21 = uVar21 + lVar28;
    uVar94 = ((uVar80 ^ uVar83) & uVar66 ^ uVar80 & uVar83) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar101 = (uVar36 >> 7 ^
              (uVar95 << 0x38 | uVar36 >> 8) ^ (uVar36 >> 1 | (ulong)((uVar95 & 1) != 0) << 0x3f)) +
              uVar113 + uVar44 +
              (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
    lVar28 = uVar87 + uVar101 + ((uVar59 ^ uVar32) & uVar21 ^ uVar32) + 0x6ca6351e003826f +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar83 = uVar83 + lVar28;
    uVar29 = ((uVar66 ^ uVar80) & uVar94 ^ uVar66 & uVar80) +
             ((uVar94 * 0x2000000 | uVar94 >> 0x27) ^
             (uVar94 * 0x40000000 | uVar94 >> 0x22) ^ (uVar94 << 0x24 | uVar94 >> 0x1c)) + lVar28;
    uVar82 = (uVar27 >> 7 ^
             (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
             uVar36 + uVar39 +
             (uVar40 >> 6 ^ (uVar40 * 8 | uVar40 >> 0x3d) ^ (uVar40 << 0x2d | uVar40 >> 0x13));
    lVar28 = uVar32 + uVar82 + ((uVar21 ^ uVar59) & uVar83 ^ uVar59) + 0x142929670a0e6e70 +
             ((uVar83 * 0x800000 | uVar83 >> 0x29) ^
             (uVar83 << 0x2e | uVar83 >> 0x12) ^ (uVar83 << 0x32 | uVar83 >> 0xe));
    uVar80 = uVar80 + lVar28;
    uVar72 = ((uVar94 ^ uVar66) & uVar29 ^ uVar94 & uVar66) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar32 = (uVar43 >> 7 ^
             (uVar43 << 0x38 | uVar43 >> 8) ^ (uVar43 >> 1 | (ulong)((uVar43 & 1) != 0) << 0x3f)) +
             uVar27 + uVar91 +
             (uVar101 >> 6 ^ (uVar101 * 8 | uVar101 >> 0x3d) ^ (uVar101 << 0x2d | uVar101 >> 0x13));
    lVar28 = uVar59 + uVar32 + ((uVar83 ^ uVar21) & uVar80 ^ uVar21) + 0x27b70a8546d22ffc +
             ((uVar80 * 0x800000 | uVar80 >> 0x29) ^
             (uVar80 << 0x2e | uVar80 >> 0x12) ^ (uVar80 << 0x32 | uVar80 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar38 = ((uVar29 ^ uVar94) & uVar72 ^ uVar29 & uVar94) +
             ((uVar72 * 0x2000000 | uVar72 >> 0x27) ^
             (uVar72 * 0x40000000 | uVar72 >> 0x22) ^ (uVar72 << 0x24 | uVar72 >> 0x1c)) + lVar28;
    uVar87 = (uVar70 >> 7 ^
             (uVar70 << 0x38 | uVar70 >> 8) ^ (uVar70 >> 1 | (ulong)((uVar70 & 1) != 0) << 0x3f)) +
             uVar43 + uVar57 +
             (uVar82 >> 6 ^ (uVar82 * 8 | uVar82 >> 0x3d) ^ (uVar82 << 0x2d | uVar82 >> 0x13));
    lVar28 = uVar21 + uVar87 + ((uVar80 ^ uVar83) & uVar66 ^ uVar83) + 0x2e1b21385c26c926 +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar94 = uVar94 + lVar28;
    uVar86 = ((uVar72 ^ uVar29) & uVar38 ^ uVar72 & uVar29) +
             ((uVar38 * 0x2000000 | uVar38 >> 0x27) ^
             (uVar38 * 0x40000000 | uVar38 >> 0x22) ^ (uVar38 << 0x24 | uVar38 >> 0x1c)) + lVar28;
    uVar34 = (uVar81 >> 7 ^
             (uVar81 << 0x38 | uVar81 >> 8) ^ (uVar81 >> 1 | (ulong)((uVar81 & 1) != 0) << 0x3f)) +
             uVar70 + uVar33 +
             (uVar32 >> 6 ^ (uVar32 * 8 | uVar32 >> 0x3d) ^ (uVar32 << 0x2d | uVar32 >> 0x13));
    lVar28 = uVar83 + uVar34 + ((uVar66 ^ uVar80) & uVar94 ^ uVar80) + 0x4d2c6dfc5ac42aed +
             ((uVar94 * 0x800000 | uVar94 >> 0x29) ^
             (uVar94 << 0x2e | uVar94 >> 0x12) ^ (uVar94 << 0x32 | uVar94 >> 0xe));
    uVar29 = uVar29 + lVar28;
    uVar21 = ((uVar38 ^ uVar72) & uVar86 ^ uVar38 & uVar72) +
             ((uVar86 * 0x2000000 | uVar86 >> 0x27) ^
             (uVar86 * 0x40000000 | uVar86 >> 0x22) ^ (uVar86 << 0x24 | uVar86 >> 0x1c)) + lVar28;
    uVar35 = (uVar42 >> 7 ^
             (uVar42 << 0x38 | uVar42 >> 8) ^ (uVar42 >> 1 | (ulong)((uVar42 & 1) != 0) << 0x3f)) +
             uVar81 + uVar22 +
             (uVar87 >> 6 ^ (uVar87 * 8 | uVar87 >> 0x3d) ^ (uVar87 << 0x2d | uVar87 >> 0x13));
    lVar28 = uVar80 + uVar35 + ((uVar94 ^ uVar66) & uVar29 ^ uVar66) + 0x53380d139d95b3df +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
    uVar72 = uVar72 + lVar28;
    uVar83 = ((uVar86 ^ uVar38) & uVar21 ^ uVar86 & uVar38) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar36 = (uVar58 >> 7 ^
             (uVar58 << 0x38 | uVar58 >> 8) ^ (uVar58 >> 1 | (ulong)((uVar58 & 1) != 0) << 0x3f)) +
             uVar42 + uVar40 +
             (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
    lVar28 = uVar66 + uVar36 + ((uVar29 ^ uVar94) & uVar72 ^ uVar94) + 0x650a73548baf63de +
             ((uVar72 * 0x800000 | uVar72 >> 0x29) ^
             (uVar72 << 0x2e | uVar72 >> 0x12) ^ (uVar72 << 0x32 | uVar72 >> 0xe));
    uVar38 = uVar38 + lVar28;
    uVar66 = ((uVar21 ^ uVar86) & uVar83 ^ uVar21 & uVar86) +
             ((uVar83 * 0x2000000 | uVar83 >> 0x27) ^
             (uVar83 * 0x40000000 | uVar83 >> 0x22) ^ (uVar83 << 0x24 | uVar83 >> 0x1c)) + lVar28;
    uVar27 = (uVar71 >> 7 ^
             (uVar71 << 0x38 | uVar71 >> 8) ^ (uVar71 >> 1 | (ulong)((uVar71 & 1) != 0) << 0x3f)) +
             uVar58 + uVar101 +
             (uVar35 >> 6 ^ (uVar35 * 8 | uVar35 >> 0x3d) ^ (uVar35 << 0x2d | uVar35 >> 0x13));
    lVar28 = uVar94 + uVar27 + ((uVar72 ^ uVar29) & uVar38 ^ uVar29) + 0x766a0abb3c77b2a8 +
             ((uVar38 * 0x800000 | uVar38 >> 0x29) ^
             (uVar38 << 0x2e | uVar38 >> 0x12) ^ (uVar38 << 0x32 | uVar38 >> 0xe));
    uVar86 = uVar86 + lVar28;
    uVar80 = ((uVar83 ^ uVar21) & uVar66 ^ uVar83 & uVar21) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar58 = (uVar44 >> 7 ^
             (uVar44 << 0x38 | uVar44 >> 8) ^ (uVar44 >> 1 | (ulong)((uVar44 & 1) != 0) << 0x3f)) +
             uVar71 + uVar82 +
             (uVar36 >> 6 ^ (uVar36 * 8 | uVar36 >> 0x3d) ^ (uVar36 << 0x2d | uVar36 >> 0x13));
    lVar28 = uVar29 + uVar58 + ((uVar38 ^ uVar72) & uVar86 ^ uVar72) + -0x7e3d36d1b812511a +
             ((uVar86 * 0x800000 | uVar86 >> 0x29) ^
             (uVar86 << 0x2e | uVar86 >> 0x12) ^ (uVar86 << 0x32 | uVar86 >> 0xe));
    uVar21 = uVar21 + lVar28;
    uVar29 = ((uVar66 ^ uVar83) & uVar80 ^ uVar66 & uVar83) +
             ((uVar80 * 0x2000000 | uVar80 >> 0x27) ^
             (uVar80 * 0x40000000 | uVar80 >> 0x22) ^ (uVar80 << 0x24 | uVar80 >> 0x1c)) + lVar28;
    uVar43 = (uVar39 >> 7 ^
             (uVar39 << 0x38 | uVar39 >> 8) ^ (uVar39 >> 1 | (ulong)((uVar39 & 1) != 0) << 0x3f)) +
             uVar44 + uVar32 +
             (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
    lVar28 = uVar72 + uVar43 + ((uVar86 ^ uVar38) & uVar21 ^ uVar38) + -0x6d8dd37aeb7dcac5 +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar83 = uVar83 + lVar28;
    uVar71 = ((uVar80 ^ uVar66) & uVar29 ^ uVar80 & uVar66) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar59 = (uVar91 >> 7 ^
             (uVar91 << 0x38 | uVar91 >> 8) ^ (uVar91 >> 1 | (ulong)((uVar91 & 1) != 0) << 0x3f)) +
             uVar39 + uVar87 +
             (uVar58 >> 6 ^ (uVar58 * 8 | uVar58 >> 0x3d) ^ (uVar58 << 0x2d | uVar58 >> 0x13));
    lVar28 = uVar38 + uVar59 + ((uVar21 ^ uVar86) & uVar83 ^ uVar86) + -0x5d40175eb30efc9c +
             ((uVar83 * 0x800000 | uVar83 >> 0x29) ^
             (uVar83 << 0x2e | uVar83 >> 0x12) ^ (uVar83 << 0x32 | uVar83 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar72 = ((uVar29 ^ uVar80) & uVar71 ^ uVar29 & uVar80) +
             ((uVar71 * 0x2000000 | uVar71 >> 0x27) ^
             (uVar71 * 0x40000000 | uVar71 >> 0x22) ^ (uVar71 << 0x24 | uVar71 >> 0x1c)) + lVar28;
    uVar95 = (uVar57 >> 7 ^
             (uVar57 << 0x38 | uVar57 >> 8) ^ (uVar57 >> 1 | (ulong)((uVar57 & 1) != 0) << 0x3f)) +
             uVar91 + uVar34 +
             (uVar43 >> 6 ^ (uVar43 * 8 | uVar43 >> 0x3d) ^ (uVar43 << 0x2d | uVar43 >> 0x13));
    lVar28 = uVar86 + uVar95 + ((uVar83 ^ uVar21) & uVar66 ^ uVar21) + -0x57e599b443bdcfff +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar80 = uVar80 + lVar28;
    uVar94 = ((uVar71 ^ uVar29) & uVar72 ^ uVar71 & uVar29) +
             ((uVar72 * 0x2000000 | uVar72 >> 0x27) ^
             (uVar72 * 0x40000000 | uVar72 >> 0x22) ^ (uVar72 << 0x24 | uVar72 >> 0x1c)) + lVar28;
    uVar57 = (uVar33 >> 7 ^
             (uVar33 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar33 & 1) != 0) << 0x3f)) +
             uVar57 + uVar35 +
             (uVar59 >> 6 ^ (uVar59 * 8 | uVar59 >> 0x3d) ^ (uVar59 << 0x2d | uVar59 >> 0x13));
    lVar28 = uVar21 + uVar57 + ((uVar66 ^ uVar83) & uVar80 ^ uVar83) + -0x3db4748f2f07686f +
             ((uVar80 * 0x800000 | uVar80 >> 0x29) ^
             (uVar80 << 0x2e | uVar80 >> 0x12) ^ (uVar80 << 0x32 | uVar80 >> 0xe));
    uVar29 = uVar29 + lVar28;
    uVar21 = ((uVar72 ^ uVar71) & uVar94 ^ uVar72 & uVar71) +
             ((uVar94 * 0x2000000 | uVar94 >> 0x27) ^
             (uVar94 * 0x40000000 | uVar94 >> 0x22) ^ (uVar94 << 0x24 | uVar94 >> 0x1c)) + lVar28;
    uVar86 = (uVar22 >> 7 ^
             (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
             uVar33 + uVar36 +
             (uVar95 >> 6 ^ (uVar95 * 8 | uVar95 >> 0x3d) ^ (uVar95 << 0x2d | uVar95 >> 0x13));
    lVar28 = uVar83 + uVar86 + ((uVar80 ^ uVar66) & uVar29 ^ uVar66) + -0x3893ae5cf9ab41d0 +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
    uVar71 = uVar71 + lVar28;
    uVar38 = ((uVar94 ^ uVar72) & uVar21 ^ uVar94 & uVar72) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar22 = (uVar40 >> 7 ^
             (uVar40 << 0x38 | uVar40 >> 8) ^ (uVar40 >> 1 | (ulong)((uVar40 & 1) != 0) << 0x3f)) +
             uVar22 + uVar27 +
             (uVar57 >> 6 ^ (uVar57 * 8 | uVar57 >> 0x3d) ^ (uVar57 << 0x2d | uVar57 >> 0x13));
    lVar28 = uVar66 + uVar22 + ((uVar29 ^ uVar80) & uVar71 ^ uVar80) + -0x2e6d17e62910ade8 +
             ((uVar71 * 0x800000 | uVar71 >> 0x29) ^
             (uVar71 << 0x2e | uVar71 >> 0x12) ^ (uVar71 << 0x32 | uVar71 >> 0xe));
    uVar72 = uVar72 + lVar28;
    uVar66 = ((uVar21 ^ uVar94) & uVar38 ^ uVar21 & uVar94) +
             ((uVar38 * 0x2000000 | uVar38 >> 0x27) ^
             (uVar38 * 0x40000000 | uVar38 >> 0x22) ^ (uVar38 << 0x24 | uVar38 >> 0x1c)) + lVar28;
    uVar83 = (uVar101 >> 7 ^
             (uVar101 << 0x38 | uVar101 >> 8) ^ (uVar101 >> 1 | (ulong)((uVar101 & 1) != 0) << 0x3f)
             ) + uVar40 + uVar58 +
             (uVar86 >> 6 ^ (uVar86 * 8 | uVar86 >> 0x3d) ^ (uVar86 << 0x2d | uVar86 >> 0x13));
    lVar28 = uVar80 + uVar83 + ((uVar71 ^ uVar29) & uVar72 ^ uVar29) + -0x2966f9dbaa9a56f0 +
             ((uVar72 * 0x800000 | uVar72 >> 0x29) ^
             (uVar72 << 0x2e | uVar72 >> 0x12) ^ (uVar72 << 0x32 | uVar72 >> 0xe));
    uVar94 = uVar94 + lVar28;
    uVar91 = ((uVar38 ^ uVar21) & uVar66 ^ uVar38 & uVar21) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar60 = (uVar82 >> 7 ^
             (uVar82 << 0x38 | uVar82 >> 8) ^ (uVar82 >> 1 | (ulong)((uVar82 & 1) != 0) << 0x3f)) +
             uVar101 + uVar43 +
             (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
    lVar28 = uVar29 + uVar60 + ((uVar72 ^ uVar71) & uVar94 ^ uVar71) + -0xbf1ca7aa88edfd6 +
             ((uVar94 * 0x800000 | uVar94 >> 0x29) ^
             (uVar94 << 0x2e | uVar94 >> 0x12) ^ (uVar94 << 0x32 | uVar94 >> 0xe));
    uVar21 = uVar21 + lVar28;
    uVar80 = ((uVar66 ^ uVar38) & uVar91 ^ uVar66 & uVar38) +
             ((uVar91 * 0x2000000 | uVar91 >> 0x27) ^
             (uVar91 * 0x40000000 | uVar91 >> 0x22) ^ (uVar91 << 0x24 | uVar91 >> 0x1c)) + lVar28;
    uVar44 = (uVar32 >> 7 ^
             (uVar32 << 0x38 | uVar32 >> 8) ^ (uVar32 >> 1 | (ulong)((uVar32 & 1) != 0) << 0x3f)) +
             uVar82 + uVar59 +
             (uVar83 >> 6 ^ (uVar83 * 8 | uVar83 >> 0x3d) ^ (uVar83 << 0x2d | uVar83 >> 0x13));
    lVar28 = uVar71 + uVar44 + ((uVar94 ^ uVar72) & uVar21 ^ uVar72) + 0x106aa07032bbd1b8 +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar38 = uVar38 + lVar28;
    uVar40 = ((uVar91 ^ uVar66) & uVar80 ^ uVar91 & uVar66) +
             ((uVar80 * 0x2000000 | uVar80 >> 0x27) ^
             (uVar80 * 0x40000000 | uVar80 >> 0x22) ^ (uVar80 << 0x24 | uVar80 >> 0x1c)) + lVar28;
    uVar33 = (uVar87 >> 7 ^
             (uVar87 << 0x38 | uVar87 >> 8) ^ (uVar87 >> 1 | (ulong)((uVar87 & 1) != 0) << 0x3f)) +
             uVar32 + uVar95 +
             (uVar60 >> 6 ^ (uVar60 * 8 | uVar60 >> 0x3d) ^ (uVar60 << 0x2d | uVar60 >> 0x13));
    lVar28 = uVar72 + uVar33 + ((uVar21 ^ uVar94) & uVar38 ^ uVar94) + 0x19a4c116b8d2d0c8 +
             ((uVar38 * 0x800000 | uVar38 >> 0x29) ^
             (uVar38 << 0x2e | uVar38 >> 0x12) ^ (uVar38 << 0x32 | uVar38 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar29 = ((uVar80 ^ uVar91) & uVar40 ^ uVar80 & uVar91) +
             ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
             (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar28;
    uVar39 = (uVar34 >> 7 ^
             (uVar34 << 0x38 | uVar34 >> 8) ^ (uVar34 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
             uVar87 + uVar57 +
             (uVar44 >> 6 ^ (uVar44 * 8 | uVar44 >> 0x3d) ^ (uVar44 << 0x2d | uVar44 >> 0x13));
    lVar28 = uVar94 + uVar39 + ((uVar38 ^ uVar21) & uVar66 ^ uVar21) + 0x1e376c085141ab53 +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar91 = uVar91 + lVar28;
    uVar82 = ((uVar40 ^ uVar80) & uVar29 ^ uVar40 & uVar80) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar42 = (uVar35 >> 7 ^
             (uVar35 << 0x38 | uVar35 >> 8) ^ (uVar35 >> 1 | (ulong)((uVar35 & 1) != 0) << 0x3f)) +
             uVar34 + uVar86 +
             (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13));
    lVar28 = uVar21 + uVar42 + ((uVar66 ^ uVar38) & uVar91 ^ uVar38) + 0x2748774cdf8eeb99 +
             ((uVar91 * 0x800000 | uVar91 >> 0x29) ^
             (uVar91 << 0x2e | uVar91 >> 0x12) ^ (uVar91 << 0x32 | uVar91 >> 0xe));
    uVar80 = uVar80 + lVar28;
    uVar71 = ((uVar29 ^ uVar40) & uVar82 ^ uVar29 & uVar40) +
             ((uVar82 * 0x2000000 | uVar82 >> 0x27) ^
             (uVar82 * 0x40000000 | uVar82 >> 0x22) ^ (uVar82 << 0x24 | uVar82 >> 0x1c)) + lVar28;
    uVar101 = (uVar36 >> 7 ^
              (uVar36 << 0x38 | uVar36 >> 8) ^ (uVar36 >> 1 | (ulong)((uVar36 & 1) != 0) << 0x3f)) +
              uVar35 + uVar22 +
              (uVar39 >> 6 ^ (uVar39 * 8 | uVar39 >> 0x3d) ^ (uVar39 << 0x2d | uVar39 >> 0x13));
    lVar28 = uVar38 + uVar101 + ((uVar91 ^ uVar66) & uVar80 ^ uVar66) + 0x34b0bcb5e19b48a8 +
             ((uVar80 * 0x800000 | uVar80 >> 0x29) ^
             (uVar80 << 0x2e | uVar80 >> 0x12) ^ (uVar80 << 0x32 | uVar80 >> 0xe));
    uVar40 = uVar40 + lVar28;
    uVar72 = ((uVar82 ^ uVar29) & uVar71 ^ uVar82 & uVar29) +
             ((uVar71 * 0x2000000 | uVar71 >> 0x27) ^
             (uVar71 * 0x40000000 | uVar71 >> 0x22) ^ (uVar71 << 0x24 | uVar71 >> 0x1c)) + lVar28;
    uVar35 = (uVar27 >> 7 ^
             (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
             uVar36 + uVar83 +
             (uVar42 >> 6 ^ (uVar42 * 8 | uVar42 >> 0x3d) ^ (uVar42 << 0x2d | uVar42 >> 0x13));
    lVar28 = uVar66 + uVar35 + ((uVar80 ^ uVar91) & uVar40 ^ uVar91) + 0x391c0cb3c5c95a63 +
             ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
             (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
    uVar29 = uVar29 + lVar28;
    uVar66 = ((uVar71 ^ uVar82) & uVar72 ^ uVar71 & uVar82) +
             ((uVar72 * 0x2000000 | uVar72 >> 0x27) ^
             (uVar72 * 0x40000000 | uVar72 >> 0x22) ^ (uVar72 << 0x24 | uVar72 >> 0x1c)) + lVar28;
    uVar87 = (uVar58 >> 7 ^
             (uVar58 << 0x38 | uVar58 >> 8) ^ (uVar58 >> 1 | (ulong)((uVar58 & 1) != 0) << 0x3f)) +
             uVar27 + uVar60 +
             (uVar101 >> 6 ^ (uVar101 * 8 | uVar101 >> 0x3d) ^ (uVar101 << 0x2d | uVar101 >> 0x13));
    lVar28 = uVar91 + uVar87 + ((uVar40 ^ uVar80) & uVar29 ^ uVar80) + 0x4ed8aa4ae3418acb +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
    uVar82 = uVar82 + lVar28;
    uVar94 = ((uVar72 ^ uVar71) & uVar66 ^ uVar72 & uVar71) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar34 = (uVar43 >> 7 ^
             (uVar43 << 0x38 | uVar43 >> 8) ^ (uVar43 >> 1 | (ulong)((uVar43 & 1) != 0) << 0x3f)) +
             uVar58 + uVar44 +
             (uVar35 >> 6 ^ (uVar35 * 8 | uVar35 >> 0x3d) ^ (uVar35 << 0x2d | uVar35 >> 0x13));
    lVar28 = uVar80 + uVar34 + ((uVar29 ^ uVar40) & uVar82 ^ uVar40) + 0x5b9cca4f7763e373 +
             ((uVar82 * 0x800000 | uVar82 >> 0x29) ^
             (uVar82 << 0x2e | uVar82 >> 0x12) ^ (uVar82 << 0x32 | uVar82 >> 0xe));
    uVar71 = uVar71 + lVar28;
    uVar91 = ((uVar66 ^ uVar72) & uVar94 ^ uVar66 & uVar72) +
             ((uVar94 * 0x2000000 | uVar94 >> 0x27) ^
             (uVar94 * 0x40000000 | uVar94 >> 0x22) ^ (uVar94 << 0x24 | uVar94 >> 0x1c)) + lVar28;
    uVar36 = (uVar59 >> 7 ^
             (uVar59 << 0x38 | uVar59 >> 8) ^ (uVar59 >> 1 | (ulong)((uVar59 & 1) != 0) << 0x3f)) +
             uVar43 + uVar33 +
             (uVar87 >> 6 ^ (uVar87 * 8 | uVar87 >> 0x3d) ^ (uVar87 << 0x2d | uVar87 >> 0x13));
    lVar28 = uVar40 + uVar36 + ((uVar82 ^ uVar29) & uVar71 ^ uVar29) + 0x682e6ff3d6b2b8a3 +
             ((uVar71 * 0x800000 | uVar71 >> 0x29) ^
             (uVar71 << 0x2e | uVar71 >> 0x12) ^ (uVar71 << 0x32 | uVar71 >> 0xe));
    uVar72 = uVar72 + lVar28;
    uVar21 = ((uVar94 ^ uVar66) & uVar91 ^ uVar94 & uVar66) +
             ((uVar91 * 0x2000000 | uVar91 >> 0x27) ^
             (uVar91 * 0x40000000 | uVar91 >> 0x22) ^ (uVar91 << 0x24 | uVar91 >> 0x1c)) + lVar28;
    uVar43 = (uVar95 >> 7 ^
             (uVar95 << 0x38 | uVar95 >> 8) ^ (uVar95 >> 1 | (ulong)((uVar95 & 1) != 0) << 0x3f)) +
             uVar59 + uVar39 +
             (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
    lVar28 = uVar29 + uVar43 + ((uVar71 ^ uVar82) & uVar72 ^ uVar82) + 0x748f82ee5defb2fc +
             ((uVar72 * 0x800000 | uVar72 >> 0x29) ^
             (uVar72 << 0x2e | uVar72 >> 0x12) ^ (uVar72 << 0x32 | uVar72 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar27 = ((uVar91 ^ uVar94) & uVar21 ^ uVar91 & uVar94) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar95 = (uVar57 >> 7 ^
             (uVar57 << 0x38 | uVar57 >> 8) ^ (uVar57 >> 1 | (ulong)((uVar57 & 1) != 0) << 0x3f)) +
             uVar95 + uVar42 +
             (uVar36 >> 6 ^ (uVar36 * 8 | uVar36 >> 0x3d) ^ (uVar36 << 0x2d | uVar36 >> 0x13));
    lVar28 = uVar82 + uVar95 + ((uVar72 ^ uVar71) & uVar66 ^ uVar71) + 0x78a5636f43172f60 +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar94 = uVar94 + lVar28;
    uVar32 = ((uVar21 ^ uVar91) & uVar27 ^ uVar21 & uVar91) +
             ((uVar27 * 0x2000000 | uVar27 >> 0x27) ^
             (uVar27 * 0x40000000 | uVar27 >> 0x22) ^ (uVar27 << 0x24 | uVar27 >> 0x1c)) + lVar28;
    uVar40 = (uVar86 >> 7 ^
             (uVar86 << 0x38 | uVar86 >> 8) ^ (uVar86 >> 1 | (ulong)((uVar86 & 1) != 0) << 0x3f)) +
             uVar57 + uVar101 +
             (uVar43 >> 6 ^ (uVar43 * 8 | uVar43 >> 0x3d) ^ (uVar43 << 0x2d | uVar43 >> 0x13));
    lVar28 = uVar71 + uVar40 + ((uVar66 ^ uVar72) & uVar94 ^ uVar72) + -0x7b3787eb5e0f548e +
             ((uVar94 * 0x800000 | uVar94 >> 0x29) ^
             (uVar94 << 0x2e | uVar94 >> 0x12) ^ (uVar94 << 0x32 | uVar94 >> 0xe));
    uVar91 = uVar91 + lVar28;
    uVar80 = ((uVar27 ^ uVar21) & uVar32 ^ uVar27 & uVar21) +
             ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
             (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar28;
    uVar57 = (uVar22 >> 7 ^
             (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
             uVar86 + uVar35 +
             (uVar95 >> 6 ^ (uVar95 * 8 | uVar95 >> 0x3d) ^ (uVar95 << 0x2d | uVar95 >> 0x13));
    lVar28 = uVar72 + uVar57 + ((uVar94 ^ uVar66) & uVar91 ^ uVar66) + -0x7338fdf7e59bc614 +
             ((uVar91 * 0x800000 | uVar91 >> 0x29) ^
             (uVar91 << 0x2e | uVar91 >> 0x12) ^ (uVar91 << 0x32 | uVar91 >> 0xe));
    uVar21 = uVar21 + lVar28;
    uVar71 = ((uVar32 ^ uVar27) & uVar80 ^ uVar32 & uVar27) +
             ((uVar80 * 0x2000000 | uVar80 >> 0x27) ^
             (uVar80 * 0x40000000 | uVar80 >> 0x22) ^ (uVar80 << 0x24 | uVar80 >> 0x1c)) + lVar28;
    uVar72 = (uVar83 >> 7 ^
             (uVar83 << 0x38 | uVar83 >> 8) ^ (uVar83 >> 1 | (ulong)((uVar83 & 1) != 0) << 0x3f)) +
             uVar22 + uVar87 +
             (uVar40 >> 6 ^ (uVar40 * 8 | uVar40 >> 0x3d) ^ (uVar40 << 0x2d | uVar40 >> 0x13));
    lVar28 = uVar66 + uVar72 + ((uVar91 ^ uVar94) & uVar21 ^ uVar94) + -0x6f410005dc9ce1d8 +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar27 = uVar27 + lVar28;
    uVar58 = ((uVar80 ^ uVar32) & uVar71 ^ uVar80 & uVar32) +
             ((uVar71 * 0x2000000 | uVar71 >> 0x27) ^
             (uVar71 * 0x40000000 | uVar71 >> 0x22) ^ (uVar71 << 0x24 | uVar71 >> 0x1c)) + lVar28;
    uVar82 = (uVar60 >> 7 ^
             (uVar60 << 0x38 | uVar60 >> 8) ^ (uVar60 >> 1 | (ulong)((uVar60 & 1) != 0) << 0x3f)) +
             uVar83 + uVar34 +
             (uVar57 >> 6 ^ (uVar57 * 8 | uVar57 >> 0x3d) ^ (uVar57 << 0x2d | uVar57 >> 0x13));
    lVar28 = uVar94 + uVar82 + ((uVar21 ^ uVar91) & uVar27 ^ uVar91) + -0x5baf9314217d4217 +
             ((uVar27 * 0x800000 | uVar27 >> 0x29) ^
             (uVar27 << 0x2e | uVar27 >> 0x12) ^ (uVar27 << 0x32 | uVar27 >> 0xe));
    uVar32 = uVar32 + lVar28;
    uVar66 = ((uVar71 ^ uVar80) & uVar58 ^ uVar71 & uVar80) +
             ((uVar58 * 0x2000000 | uVar58 >> 0x27) ^
             (uVar58 * 0x40000000 | uVar58 >> 0x22) ^ (uVar58 << 0x24 | uVar58 >> 0x1c)) + lVar28;
    uVar38 = (uVar44 >> 7 ^
             (uVar44 << 0x38 | uVar44 >> 8) ^ (uVar44 >> 1 | (ulong)((uVar44 & 1) != 0) << 0x3f)) +
             uVar60 + uVar36 +
             (uVar72 >> 6 ^ (uVar72 * 8 | uVar72 >> 0x3d) ^ (uVar72 << 0x2d | uVar72 >> 0x13));
    lVar28 = uVar91 + uVar38 + ((uVar27 ^ uVar21) & uVar32 ^ uVar21) + -0x41065c084d3986eb +
             ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
             (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
    uVar80 = uVar80 + lVar28;
    uVar29 = ((uVar58 ^ uVar71) & uVar66 ^ uVar58 & uVar71) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar22 = (uVar33 >> 7 ^
             (uVar33 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar33 & 1) != 0) << 0x3f)) +
             uVar44 + uVar43 +
             (uVar82 >> 6 ^ (uVar82 * 8 | uVar82 >> 0x3d) ^ (uVar82 << 0x2d | uVar82 >> 0x13));
    lVar28 = uVar21 + uVar22 + ((uVar32 ^ uVar27) & uVar80 ^ uVar27) + -0x398e870d1c8dacd5 +
             ((uVar80 * 0x800000 | uVar80 >> 0x29) ^
             (uVar80 << 0x2e | uVar80 >> 0x12) ^ (uVar80 << 0x32 | uVar80 >> 0xe));
    uVar71 = uVar71 + lVar28;
    uVar91 = ((uVar66 ^ uVar58) & uVar29 ^ uVar66 & uVar58) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar94 = (uVar39 >> 7 ^
             (uVar39 << 0x38 | uVar39 >> 8) ^ (uVar39 >> 1 | (ulong)((uVar39 & 1) != 0) << 0x3f)) +
             uVar33 + uVar95 +
             (uVar38 >> 6 ^ (uVar38 * 8 | uVar38 >> 0x3d) ^ (uVar38 << 0x2d | uVar38 >> 0x13));
    lVar28 = uVar27 + uVar94 + ((uVar80 ^ uVar32) & uVar71 ^ uVar32) + -0x35d8c13115d99e64 +
             ((uVar71 * 0x800000 | uVar71 >> 0x29) ^
             (uVar71 << 0x2e | uVar71 >> 0x12) ^ (uVar71 << 0x32 | uVar71 >> 0xe));
    uVar58 = uVar58 + lVar28;
    uVar86 = ((uVar29 ^ uVar66) & uVar91 ^ uVar29 & uVar66) +
             ((uVar91 * 0x2000000 | uVar91 >> 0x27) ^
             (uVar91 * 0x40000000 | uVar91 >> 0x22) ^ (uVar91 << 0x24 | uVar91 >> 0x1c)) + lVar28;
    uVar27 = (uVar42 >> 7 ^
             (uVar42 << 0x38 | uVar42 >> 8) ^ (uVar42 >> 1 | (ulong)((uVar42 & 1) != 0) << 0x3f)) +
             uVar39 + uVar40 +
             (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
    lVar28 = uVar32 + uVar27 + ((uVar71 ^ uVar80) & uVar58 ^ uVar80) + -0x2e794738de3f3df9 +
             ((uVar58 * 0x800000 | uVar58 >> 0x29) ^
             (uVar58 << 0x2e | uVar58 >> 0x12) ^ (uVar58 << 0x32 | uVar58 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar44 = ((uVar91 ^ uVar29) & uVar86 ^ uVar91 & uVar29) +
             ((uVar86 * 0x2000000 | uVar86 >> 0x27) ^
             (uVar86 * 0x40000000 | uVar86 >> 0x22) ^ (uVar86 << 0x24 | uVar86 >> 0x1c)) + lVar28;
    uVar32 = (uVar101 >> 7 ^
             (uVar101 << 0x38 | uVar101 >> 8) ^ (uVar101 >> 1 | (ulong)((uVar101 & 1) != 0) << 0x3f)
             ) + uVar42 + uVar57 +
             (uVar94 >> 6 ^ (uVar94 * 8 | uVar94 >> 0x3d) ^ (uVar94 << 0x2d | uVar94 >> 0x13));
    lVar28 = uVar80 + uVar32 + ((uVar58 ^ uVar71) & uVar66 ^ uVar71) + -0x15258229321f14e2 +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar29 = uVar29 + lVar28;
    uVar80 = ((uVar86 ^ uVar91) & uVar44 ^ uVar86 & uVar91) +
             ((uVar44 * 0x2000000 | uVar44 >> 0x27) ^
             (uVar44 * 0x40000000 | uVar44 >> 0x22) ^ (uVar44 << 0x24 | uVar44 >> 0x1c)) + lVar28;
    uVar33 = (uVar35 >> 7 ^
             (uVar35 << 0x38 | uVar35 >> 8) ^ (uVar35 >> 1 | (ulong)((uVar35 & 1) != 0) << 0x3f)) +
             uVar101 + uVar72 +
             (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
    lVar28 = uVar71 + uVar33 + ((uVar66 ^ uVar58) & uVar29 ^ uVar58) + -0xa82b08011912e88 +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
    uVar91 = uVar91 + lVar28;
    uVar101 = ((uVar44 ^ uVar86) & uVar80 ^ uVar44 & uVar86) +
              ((uVar80 * 0x2000000 | uVar80 >> 0x27) ^
              (uVar80 * 0x40000000 | uVar80 >> 0x22) ^ (uVar80 << 0x24 | uVar80 >> 0x1c)) + lVar28;
    uVar83 = (uVar87 >> 7 ^
             (uVar87 << 0x38 | uVar87 >> 8) ^ (uVar87 >> 1 | (ulong)((uVar87 & 1) != 0) << 0x3f)) +
             uVar35 + uVar82 +
             (uVar32 >> 6 ^ (uVar32 * 8 | uVar32 >> 0x3d) ^ (uVar32 << 0x2d | uVar32 >> 0x13));
    lVar28 = uVar58 + uVar83 + ((uVar29 ^ uVar66) & uVar91 ^ uVar66) + 0x6f067aa72176fba +
             ((uVar91 * 0x800000 | uVar91 >> 0x29) ^
             (uVar91 << 0x2e | uVar91 >> 0x12) ^ (uVar91 << 0x32 | uVar91 >> 0xe));
    uVar86 = uVar86 + lVar28;
    uVar71 = ((uVar80 ^ uVar44) & uVar101 ^ uVar80 & uVar44) +
             ((uVar101 * 0x2000000 | uVar101 >> 0x27) ^
             (uVar101 * 0x40000000 | uVar101 >> 0x22) ^ (uVar101 << 0x24 | uVar101 >> 0x1c)) +
             lVar28;
    uVar35 = (uVar34 >> 7 ^
             (uVar34 << 0x38 | uVar34 >> 8) ^ (uVar34 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
             uVar87 + uVar38 +
             (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13));
    lVar28 = uVar66 + uVar35 + ((uVar91 ^ uVar29) & uVar86 ^ uVar29) + 0xa637dc5a2c898a6 +
             ((uVar86 * 0x800000 | uVar86 >> 0x29) ^
             (uVar86 << 0x2e | uVar86 >> 0x12) ^ (uVar86 << 0x32 | uVar86 >> 0xe));
    uVar44 = uVar44 + lVar28;
    uVar66 = ((uVar101 ^ uVar80) & uVar71 ^ uVar101 & uVar80) +
             ((uVar71 * 0x2000000 | uVar71 >> 0x27) ^
             (uVar71 * 0x40000000 | uVar71 >> 0x22) ^ (uVar71 << 0x24 | uVar71 >> 0x1c)) + lVar28;
    uVar34 = (uVar36 >> 7 ^
             (uVar36 << 0x38 | uVar36 >> 8) ^ (uVar36 >> 1 | (ulong)((uVar36 & 1) != 0) << 0x3f)) +
             uVar34 + uVar22 +
             (uVar83 >> 6 ^ (uVar83 * 8 | uVar83 >> 0x3d) ^ (uVar83 << 0x2d | uVar83 >> 0x13));
    lVar28 = uVar29 + uVar34 + ((uVar86 ^ uVar91) & uVar44 ^ uVar91) + 0x113f9804bef90dae +
             ((uVar44 * 0x800000 | uVar44 >> 0x29) ^
             (uVar44 << 0x2e | uVar44 >> 0x12) ^ (uVar44 << 0x32 | uVar44 >> 0xe));
    uVar80 = uVar80 + lVar28;
    uVar21 = ((uVar71 ^ uVar101) & uVar66 ^ uVar71 & uVar101) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    uVar36 = (uVar43 >> 7 ^
             (uVar43 << 0x38 | uVar43 >> 8) ^ (uVar43 >> 1 | (ulong)((uVar43 & 1) != 0) << 0x3f)) +
             uVar36 + uVar94 +
             (uVar35 >> 6 ^ (uVar35 * 8 | uVar35 >> 0x3d) ^ (uVar35 << 0x2d | uVar35 >> 0x13));
    lVar28 = uVar91 + uVar36 + ((uVar44 ^ uVar86) & uVar80 ^ uVar86) + 0x1b710b35131c471b +
             ((uVar80 * 0x800000 | uVar80 >> 0x29) ^
             (uVar80 << 0x2e | uVar80 >> 0x12) ^ (uVar80 << 0x32 | uVar80 >> 0xe));
    uVar101 = uVar101 + lVar28;
    uVar91 = ((uVar66 ^ uVar71) & uVar21 ^ uVar66 & uVar71) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    uVar43 = (uVar95 >> 7 ^
             (uVar95 << 0x38 | uVar95 >> 8) ^ (uVar95 >> 1 | (ulong)((uVar95 & 1) != 0) << 0x3f)) +
             uVar43 + uVar27 +
             (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
    lVar28 = uVar86 + uVar43 + ((uVar80 ^ uVar44) & uVar101 ^ uVar44) + 0x28db77f523047d84 +
             ((uVar101 * 0x800000 | uVar101 >> 0x29) ^
             (uVar101 << 0x2e | uVar101 >> 0x12) ^ (uVar101 << 0x32 | uVar101 >> 0xe));
    uVar71 = uVar71 + lVar28;
    uVar29 = ((uVar21 ^ uVar66) & uVar91 ^ uVar21 & uVar66) +
             ((uVar91 * 0x2000000 | uVar91 >> 0x27) ^
             (uVar91 * 0x40000000 | uVar91 >> 0x22) ^ (uVar91 << 0x24 | uVar91 >> 0x1c)) + lVar28;
    uVar32 = (uVar40 >> 7 ^
             (uVar40 << 0x38 | uVar40 >> 8) ^ (uVar40 >> 1 | (ulong)((uVar40 & 1) != 0) << 0x3f)) +
             uVar95 + uVar32 +
             (uVar36 >> 6 ^ (uVar36 * 8 | uVar36 >> 0x3d) ^ (uVar36 << 0x2d | uVar36 >> 0x13));
    lVar28 = uVar44 + uVar32 + ((uVar101 ^ uVar80) & uVar71 ^ uVar80) + 0x32caab7b40c72493 +
             ((uVar71 * 0x800000 | uVar71 >> 0x29) ^
             (uVar71 << 0x2e | uVar71 >> 0x12) ^ (uVar71 << 0x32 | uVar71 >> 0xe));
    uVar66 = uVar66 + lVar28;
    uVar87 = ((uVar91 ^ uVar21) & uVar29 ^ uVar91 & uVar21) +
             ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
             (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar28;
    uVar44 = (uVar57 >> 7 ^
             (uVar57 << 0x38 | uVar57 >> 8) ^ (uVar57 >> 1 | (ulong)((uVar57 & 1) != 0) << 0x3f)) +
             uVar40 + uVar33 +
             (uVar43 >> 6 ^ (uVar43 * 8 | uVar43 >> 0x3d) ^ (uVar43 << 0x2d | uVar43 >> 0x13));
    lVar28 = uVar80 + uVar44 + ((uVar71 ^ uVar101) & uVar66 ^ uVar101) + 0x3c9ebe0a15c9bebc +
             ((uVar66 * 0x800000 | uVar66 >> 0x29) ^
             (uVar66 << 0x2e | uVar66 >> 0x12) ^ (uVar66 << 0x32 | uVar66 >> 0xe));
    uVar21 = uVar21 + lVar28;
    uVar40 = ((uVar29 ^ uVar91) & uVar87 ^ uVar29 & uVar91) +
             ((uVar87 * 0x2000000 | uVar87 >> 0x27) ^
             (uVar87 * 0x40000000 | uVar87 >> 0x22) ^ (uVar87 << 0x24 | uVar87 >> 0x1c)) + lVar28;
    uVar80 = (uVar72 >> 7 ^
             (uVar72 << 0x38 | uVar72 >> 8) ^ (uVar72 >> 1 | (ulong)((uVar72 & 1) != 0) << 0x3f)) +
             uVar57 + uVar83 +
             (uVar32 >> 6 ^ (uVar32 * 8 | uVar32 >> 0x3d) ^ (uVar32 << 0x2d | uVar32 >> 0x13));
    lVar28 = uVar101 + uVar80 + ((uVar66 ^ uVar71) & uVar21 ^ uVar71) + 0x431d67c49c100d4c +
             ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
             (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar91 = uVar91 + lVar28;
    uVar83 = ((uVar87 ^ uVar29) & uVar40 ^ uVar87 & uVar29) +
             ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
             (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar28;
    uVar32 = (uVar82 >> 7 ^
             (uVar82 << 0x38 | uVar82 >> 8) ^ (uVar82 >> 1 | (ulong)((uVar82 & 1) != 0) << 0x3f)) +
             uVar72 + uVar35 +
             (uVar44 >> 6 ^ (uVar44 * 8 | uVar44 >> 0x3d) ^ (uVar44 << 0x2d | uVar44 >> 0x13));
    lVar28 = uVar71 + uVar32 + ((uVar21 ^ uVar66) & uVar91 ^ uVar66) + 0x4cc5d4becb3e42b6 +
             ((uVar91 * 0x800000 | uVar91 >> 0x29) ^
             (uVar91 << 0x2e | uVar91 >> 0x12) ^ (uVar91 << 0x32 | uVar91 >> 0xe));
    uVar29 = uVar29 + lVar28;
    uVar44 = ((uVar40 ^ uVar87) & uVar83 ^ uVar40 & uVar87) +
             ((uVar83 * 0x2000000 | uVar83 >> 0x27) ^
             (uVar83 * 0x40000000 | uVar83 >> 0x22) ^ (uVar83 << 0x24 | uVar83 >> 0x1c)) + lVar28;
    uVar82 = (uVar38 >> 7 ^
             (uVar38 << 0x38 | uVar38 >> 8) ^ (uVar38 >> 1 | (ulong)((uVar38 & 1) != 0) << 0x3f)) +
             uVar82 + uVar34 +
             (uVar80 >> 6 ^ (uVar80 * 8 | uVar80 >> 0x3d) ^ (uVar80 << 0x2d | uVar80 >> 0x13));
    lVar28 = uVar66 + uVar82 + ((uVar91 ^ uVar21) & uVar29 ^ uVar21) + 0x597f299cfc657e2a +
             ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
             (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
    uVar87 = uVar87 + lVar28;
    uVar66 = ((uVar83 ^ uVar40) & uVar44 ^ uVar83 & uVar40) +
             ((uVar44 * 0x2000000 | uVar44 >> 0x27) ^
             (uVar44 * 0x40000000 | uVar44 >> 0x22) ^ (uVar44 << 0x24 | uVar44 >> 0x1c)) + lVar28;
    lVar28 = (uVar22 >> 7 ^
             (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
             uVar38 + uVar36 +
             (uVar32 >> 6 ^ (uVar32 * 8 | uVar32 >> 0x3d) ^ (uVar32 << 0x2d | uVar32 >> 0x13)) +
             uVar21 + ((uVar29 ^ uVar91) & uVar87 ^ uVar91) + 0x5fcb6fab3ad6faec +
             ((uVar87 * 0x800000 | uVar87 >> 0x29) ^
             (uVar87 << 0x2e | uVar87 >> 0x12) ^ (uVar87 << 0x32 | uVar87 >> 0xe));
    uVar40 = uVar40 + lVar28;
    uVar21 = ((uVar44 ^ uVar83) & uVar66 ^ uVar44 & uVar83) +
             ((uVar66 * 0x2000000 | uVar66 >> 0x27) ^
             (uVar66 * 0x40000000 | uVar66 >> 0x22) ^ (uVar66 << 0x24 | uVar66 >> 0x1c)) + lVar28;
    lVar28 = (uVar94 >> 7 ^
             (uVar94 << 0x38 | uVar94 >> 8) ^ (uVar94 >> 1 | (ulong)((uVar94 & 1) != 0) << 0x3f)) +
             uVar22 + uVar43 +
             (uVar82 >> 6 ^ (uVar82 * 8 | uVar82 >> 0x3d) ^ (uVar82 << 0x2d | uVar82 >> 0x13)) +
             uVar91 + ((uVar87 ^ uVar29) & uVar40 ^ uVar29) + 0x6c44198c4a475817 +
             ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
             (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
    (s->digest).i64[0] =
         ((uVar66 ^ uVar44) & uVar21 ^ uVar66 & uVar44) + uVar9 +
         ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
         (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar28;
    (s->digest).i64[1] = uVar21 + uVar10;
    (s->digest).i64[2] = uVar66 + uVar11;
    (s->digest).i64[3] = uVar44 + uVar12;
    (s->digest).i64[4] = uVar83 + uVar13 + lVar28;
    (s->digest).i64[5] = uVar40 + uVar14;
    (s->digest).i64[6] = uVar87 + uVar15;
    (s->digest).i64[7] = uVar29 + uVar16;
  }
  return;
}

Assistant:

static inline void fio_sha2_perform_all_rounds(fio_sha2_s *s,
                                               const uint8_t *data) {
  if (s->type & 1) { /* 512 derived type */
    // process values for the 64bit words
    uint64_t a = s->digest.i64[0];
    uint64_t b = s->digest.i64[1];
    uint64_t c = s->digest.i64[2];
    uint64_t d = s->digest.i64[3];
    uint64_t e = s->digest.i64[4];
    uint64_t f = s->digest.i64[5];
    uint64_t g = s->digest.i64[6];
    uint64_t h = s->digest.i64[7];
    uint64_t t1, t2, w[80];
    w[0] = fio_str2u64(data);
    w[1] = fio_str2u64(data + 8);
    w[2] = fio_str2u64(data + 16);
    w[3] = fio_str2u64(data + 24);
    w[4] = fio_str2u64(data + 32);
    w[5] = fio_str2u64(data + 40);
    w[6] = fio_str2u64(data + 48);
    w[7] = fio_str2u64(data + 56);
    w[8] = fio_str2u64(data + 64);
    w[9] = fio_str2u64(data + 72);
    w[10] = fio_str2u64(data + 80);
    w[11] = fio_str2u64(data + 88);
    w[12] = fio_str2u64(data + 96);
    w[13] = fio_str2u64(data + 104);
    w[14] = fio_str2u64(data + 112);
    w[15] = fio_str2u64(data + 120);

#undef perform_single_round
#define perform_single_round(i)                                                \
  t1 = h + Eps1_64(e) + Ch(e, f, g) + sha2_512_words[i] + w[i];                \
  t2 = Eps0_64(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

#define perform_4rounds(i)                                                     \
  perform_single_round(i);                                                     \
  perform_single_round(i + 1);                                                 \
  perform_single_round(i + 2);                                                 \
  perform_single_round(i + 3);

    perform_4rounds(0);
    perform_4rounds(4);
    perform_4rounds(8);
    perform_4rounds(12);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[i] = Omg1_64(w[i - 2]) + w[i - 7] + Omg0_64(w[i - 15]) + w[i - 16];        \
  t1 = h + Eps1_64(e) + Ch(e, f, g) + sha2_512_words[i] + w[i];                \
  t2 = Eps0_64(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

    perform_4rounds(16);
    perform_4rounds(20);
    perform_4rounds(24);
    perform_4rounds(28);
    perform_4rounds(32);
    perform_4rounds(36);
    perform_4rounds(40);
    perform_4rounds(44);
    perform_4rounds(48);
    perform_4rounds(52);
    perform_4rounds(56);
    perform_4rounds(60);
    perform_4rounds(64);
    perform_4rounds(68);
    perform_4rounds(72);
    perform_4rounds(76);

    s->digest.i64[0] += a;
    s->digest.i64[1] += b;
    s->digest.i64[2] += c;
    s->digest.i64[3] += d;
    s->digest.i64[4] += e;
    s->digest.i64[5] += f;
    s->digest.i64[6] += g;
    s->digest.i64[7] += h;
    return;
  } else {
    // process values for the 32bit words
    uint32_t a = s->digest.i32[0];
    uint32_t b = s->digest.i32[1];
    uint32_t c = s->digest.i32[2];
    uint32_t d = s->digest.i32[3];
    uint32_t e = s->digest.i32[4];
    uint32_t f = s->digest.i32[5];
    uint32_t g = s->digest.i32[6];
    uint32_t h = s->digest.i32[7];
    uint32_t t1, t2, w[64];

    w[0] = fio_str2u32(data);
    w[1] = fio_str2u32(data + 4);
    w[2] = fio_str2u32(data + 8);
    w[3] = fio_str2u32(data + 12);
    w[4] = fio_str2u32(data + 16);
    w[5] = fio_str2u32(data + 20);
    w[6] = fio_str2u32(data + 24);
    w[7] = fio_str2u32(data + 28);
    w[8] = fio_str2u32(data + 32);
    w[9] = fio_str2u32(data + 36);
    w[10] = fio_str2u32(data + 40);
    w[11] = fio_str2u32(data + 44);
    w[12] = fio_str2u32(data + 48);
    w[13] = fio_str2u32(data + 52);
    w[14] = fio_str2u32(data + 56);
    w[15] = fio_str2u32(data + 60);

#undef perform_single_round
#define perform_single_round(i)                                                \
  t1 = h + Eps1_32(e) + Ch(e, f, g) + sha2_256_words[i] + w[i];                \
  t2 = Eps0_32(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

    perform_4rounds(0);
    perform_4rounds(4);
    perform_4rounds(8);
    perform_4rounds(12);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[i] = Omg1_32(w[i - 2]) + w[i - 7] + Omg0_32(w[i - 15]) + w[i - 16];        \
  t1 = h + Eps1_32(e) + Ch(e, f, g) + sha2_256_words[i] + w[i];                \
  t2 = Eps0_32(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

    perform_4rounds(16);
    perform_4rounds(20);
    perform_4rounds(24);
    perform_4rounds(28);
    perform_4rounds(32);
    perform_4rounds(36);
    perform_4rounds(40);
    perform_4rounds(44);
    perform_4rounds(48);
    perform_4rounds(52);
    perform_4rounds(56);
    perform_4rounds(60);

    s->digest.i32[0] += a;
    s->digest.i32[1] += b;
    s->digest.i32[2] += c;
    s->digest.i32[3] += d;
    s->digest.i32[4] += e;
    s->digest.i32[5] += f;
    s->digest.i32[6] += g;
    s->digest.i32[7] += h;
  }
}